

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniminer_tests.cpp
# Opt level: O0

void __thiscall miniminer_tests::miniminer_1p1c::test_method(miniminer_1p1c *this)

{
  initializer_list<COutPoint> __l;
  initializer_list<COutPoint> __l_00;
  initializer_list<COutPoint> __l_01;
  initializer_list<COutPoint> __l_02;
  initializer_list<COutPoint> __l_03;
  initializer_list<COutPoint> __l_04;
  initializer_list<COutPoint> __l_05;
  initializer_list<COutPoint> __l_06;
  initializer_list<COutPoint> __l_07;
  initializer_list<COutPoint> __l_08;
  initializer_list<COutPoint> __l_09;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_10;
  initializer_list<CFeeRate> __l_11;
  initializer_list<COutPoint> __l_12;
  initializer_list<transaction_identifier<false>_> __l_13;
  initializer_list<transaction_identifier<false>_> __l_14;
  initializer_list<transaction_identifier<false>_> __l_15;
  initializer_list<transaction_identifier<false>_> __l_16;
  initializer_list<transaction_identifier<false>_> __l_17;
  initializer_list<transaction_identifier<false>_> __l_18;
  initializer_list<transaction_identifier<false>_> __l_19;
  initializer_list<transaction_identifier<false>_> __l_20;
  bool bVar1;
  pointer ppVar2;
  const_iterator pmVar3;
  pointer ppVar4;
  CAmount CVar5;
  mapped_type *pmVar6;
  MiniMiner *pMVar7;
  CTxMemPool *mempool;
  uint256 *outpoints;
  const_iterator pmVar8;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffbd48;
  lazy_ostream *in_stack_ffffffffffffbd50;
  char *in_stack_ffffffffffffbd58;
  undefined4 in_stack_ffffffffffffbd60;
  uint32_t in_stack_ffffffffffffbd64;
  undefined4 in_stack_ffffffffffffbd68;
  int in_stack_ffffffffffffbd6c;
  COutPoint *in_stack_ffffffffffffbd70;
  undefined4 in_stack_ffffffffffffbd78;
  int in_stack_ffffffffffffbd7c;
  CTxMemPoolEntry *in_stack_ffffffffffffbd80;
  undefined4 in_stack_ffffffffffffbd88;
  uint in_stack_ffffffffffffbd8c;
  iterator in_stack_ffffffffffffbd90;
  less<transaction_identifier<false>_> *in_stack_ffffffffffffbd98;
  TestMemPoolEntryHelper *in_stack_ffffffffffffbda0;
  undefined4 in_stack_ffffffffffffbdb0;
  undefined4 in_stack_ffffffffffffbdb4;
  vector<COutPoint,_std::allocator<COutPoint>_> *in_stack_ffffffffffffbdb8;
  undefined4 in_stack_ffffffffffffbdd8;
  undefined4 in_stack_ffffffffffffbddc;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *in_stack_ffffffffffffbde0;
  MiniMiner *in_stack_ffffffffffffbde8;
  CAmount *in_stack_ffffffffffffbe08;
  uint256 *in_stack_ffffffffffffbe10;
  CTxMemPool *in_stack_ffffffffffffbe18;
  map<transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
  *in_stack_ffffffffffffbe80;
  vector<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
  *in_stack_ffffffffffffbe88;
  MiniMiner *in_stack_ffffffffffffbe90;
  vector<COutPoint,_std::allocator<COutPoint>_> *in_stack_ffffffffffffc0c8;
  CTxMemPool *in_stack_ffffffffffffc0d0;
  MiniMiner *in_stack_ffffffffffffc0d8;
  map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
  *local_3cf0;
  undefined1 *local_38c0;
  map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
  *sequences;
  const_iterator __end1_7;
  const_iterator __begin1_7;
  initializer_list<std::map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>_>
  *__range1_7;
  TxDimensions *tx4_dimensions_1;
  TxDimensions *tx2_dimensions_1;
  TxDimensions *tx0_dimensions_1;
  map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
  *bump_fees_2;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  initializer_list<std::map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>_>
  *__range2_1;
  CFeeRate *target_feerate_1;
  vector<CFeeRate,_std::allocator<CFeeRate>_> *__range1_6;
  TxDimensions *tx5_dimensions;
  TxDimensions *tx4_dimensions;
  TxDimensions *tx3_dimensions;
  TxDimensions *tx2_dimensions;
  TxDimensions *tx0_dimensions;
  CFeeRate *target_feerate;
  vector<CFeeRate,_std::allocator<CFeeRate>_> *__range1_5;
  COutPoint *outpoint_3;
  vector<COutPoint,_std::allocator<COutPoint>_> *__range2;
  CFeeRate *feerate;
  vector<CFeeRate,_std::allocator<CFeeRate>_> *__range1_4;
  COutPoint *outpoint_2;
  vector<COutPoint,_std::allocator<COutPoint>_> *__range1_3;
  CTxMemPoolEntry *entry_1;
  shared_ptr<const_CTransaction> *tx;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *__range1_2;
  COutPoint *outpoint_1;
  vector<COutPoint,_std::allocator<COutPoint>_> *__range1_1;
  COutPoint *outpoint;
  vector<COutPoint,_std::allocator<COutPoint>_> *__range1;
  CTxMemPool *pool;
  miniminer_1p1c *this_local;
  lazy_ostream local_3310;
  undefined1 local_32f8 [64];
  lazy_ostream local_32b8;
  undefined1 local_32a0 [64];
  lazy_ostream local_3260;
  undefined1 local_3248 [64];
  lazy_ostream local_3208;
  undefined1 local_31f0 [64];
  lazy_ostream local_31b0;
  undefined1 local_3198 [64];
  lazy_ostream local_3158;
  undefined1 local_3140 [64];
  lazy_ostream local_3100;
  undefined1 local_30e8 [64];
  lazy_ostream local_30a8;
  undefined1 local_3090 [64];
  undefined1 *local_3050;
  undefined8 local_3048;
  const_string local_3040 [2];
  lazy_ostream local_3020 [2];
  assertion_result local_3000 [2];
  const_string local_2fc8 [2];
  lazy_ostream local_2fa8 [2];
  assertion_result local_2f88 [3];
  undefined8 local_2f40;
  int local_2f34;
  undefined8 local_2f30;
  int local_2f24;
  undefined8 local_2f20;
  int local_2f14;
  undefined8 local_2f10;
  int local_2f04;
  int32_t tx7_vsize;
  int32_t tx6_vsize;
  int32_t tx5_vsize;
  int32_t tx4_vsize;
  int32_t tx3_vsize;
  int32_t tx2_vsize;
  int32_t tx1_vsize;
  int32_t tx0_vsize;
  vector<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_> miniminer_info;
  lazy_ostream local_2ec8;
  undefined1 local_2eb0 [68];
  lazy_ostream local_2e6c;
  undefined1 local_2e58 [64];
  long it4_spent;
  CFeeRate tx4_feerate_unbumped;
  lazy_ostream local_2e00;
  undefined1 local_2de8 [68];
  lazy_ostream local_2da4;
  undefined1 local_2d90 [64];
  long it2_spent;
  CFeeRate tx2_feerate_unbumped;
  lazy_ostream local_2d38;
  undefined1 local_2d20 [68];
  lazy_ostream local_2cdc;
  undefined1 local_2cc8 [64];
  CAmount it0_spent;
  _Base_ptr local_2c80;
  const_string local_2c78 [2];
  lazy_ostream local_2c58 [2];
  assertion_result local_2c38 [2];
  map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
  *local_2c00;
  undefined8 local_2bf8;
  lazy_ostream local_2bf0;
  undefined1 local_2be0 [16];
  undefined1 local_2bd0 [64];
  const_string local_2b90 [2];
  lazy_ostream local_2b70 [2];
  assertion_result local_2b50 [2];
  const_string local_2b18 [2];
  lazy_ostream local_2af8 [2];
  assertion_result local_2ad8 [2];
  lazy_ostream local_2aa0;
  undefined1 local_2a90 [16];
  undefined1 local_2a80 [64];
  const_string local_2a40 [2];
  lazy_ostream local_2a20 [2];
  assertion_result local_2a00 [2];
  const_string local_29c8 [2];
  lazy_ostream local_29a8 [2];
  assertion_result local_2988 [2];
  const_iterator __end1_6;
  const_iterator __begin1_6;
  lazy_ostream local_2940;
  undefined1 local_2928 [68];
  lazy_ostream local_28e4;
  undefined1 local_28d0 [64];
  CAmount bumpfee4;
  long local_2888;
  CFeeRate tx4_feerate;
  lazy_ostream local_2868;
  undefined1 local_2850 [68];
  lazy_ostream local_280c;
  undefined1 local_27f8 [64];
  CAmount bumpfee2;
  long local_27b0;
  CFeeRate tx2_feerate;
  lazy_ostream local_2790;
  undefined1 local_2778 [68];
  lazy_ostream local_2734;
  undefined1 local_2720 [64];
  CAmount bumpfee0;
  _Base_ptr local_26d8;
  lazy_ostream local_26d0;
  undefined1 local_26c0 [16];
  undefined1 local_26b0 [64];
  const_string local_2670 [2];
  lazy_ostream local_2650 [2];
  assertion_result local_2630 [2];
  const_string local_25f8 [2];
  lazy_ostream local_25d8 [2];
  assertion_result local_25b8 [2];
  const_string local_2580 [2];
  lazy_ostream local_2560 [2];
  assertion_result local_2540 [2];
  const_iterator __end1_5;
  const_iterator __begin1_5;
  lazy_ostream local_24f4;
  undefined1 local_24e0 [64];
  const_string local_24a0 [2];
  lazy_ostream local_2480 [2];
  _Base_ptr local_2460;
  assertion_result local_2458 [2];
  iterator it;
  iterator __end2;
  iterator __begin2;
  const_string local_2408 [2];
  lazy_ostream local_23e8 [2];
  assertion_result local_23c8 [2];
  const_string local_2390 [2];
  lazy_ostream local_2370 [2];
  assertion_result local_2350 [2];
  const_string local_2318 [2];
  lazy_ostream local_22f8 [2];
  assertion_result local_22d8 [2];
  const_string local_22a0 [2];
  lazy_ostream local_2280 [2];
  assertion_result local_2260 [2];
  const_iterator __end1_4;
  const_iterator __begin1_4;
  const_string local_2218 [2];
  lazy_ostream local_21f8 [2];
  assertion_result local_21d8 [2];
  iterator __end1_3;
  iterator __begin1_3;
  vector<COutPoint,_std::allocator<COutPoint>_> nonexistent_outpoints;
  vector<CFeeRate,_std::allocator<CFeeRate>_> various_normal_feerates;
  iterator __end1_2;
  iterator __begin1_2;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  all_transactions;
  vector<COutPoint,_std::allocator<COutPoint>_> all_parent_outputs;
  const_string local_20d8 [2];
  lazy_ostream local_20b8 [2];
  assertion_result local_2098 [2];
  iterator __end1_1;
  iterator __begin1_1;
  vector<COutPoint,_std::allocator<COutPoint>_> all_spent_outpoints;
  const_string local_2030 [2];
  lazy_ostream local_2010;
  undefined8 local_2000;
  assertion_result local_1ff0 [2];
  iterator __end1;
  iterator __begin1;
  vector<COutPoint,_std::allocator<COutPoint>_> all_unspent_outpoints;
  CTransactionRef tx7;
  CTransactionRef tx6;
  CAmount tx5_mod_fee;
  CAmount tx5_delta;
  CTransactionRef tx5;
  CTransactionRef tx4;
  CTransactionRef tx3;
  CTransactionRef tx2;
  CTransactionRef tx1;
  CTransactionRef tx0;
  TestMemPoolEntryHelper entry;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  undefined1 local_1d08 [96];
  MiniMiner miniminer_pool;
  MiniMiner miniminer_manual;
  map<transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
  descendant_caches;
  map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
  local_1600 [2];
  map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
  bump_fees_all_parents;
  MiniMiner mini_miner_all_parents;
  map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
  bump_fees_all_spent;
  MiniMiner mini_miner_all_spent;
  map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
  bump_fees_1;
  MiniMiner mini_miner_1;
  map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
  bump_fees;
  MiniMiner mini_miner;
  map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
  tx_dims;
  undefined1 local_d18 [128];
  undefined1 local_c98 [3216];
  long local_8;
  
  local_2000 = 0;
  local_3000[0].p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x0;
  local_3000[0]._1_7_ = 0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  inline_assertion_check<true,std::unique_ptr<CTxMemPool,std::default_delete<CTxMemPool>>&>
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)
             CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
             (char *)in_stack_ffffffffffffbd80,in_stack_ffffffffffffbd7c,
             (char *)in_stack_ffffffffffffbd70,
             (char *)CONCAT44(in_stack_ffffffffffffbd6c,in_stack_ffffffffffffbd68));
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator*
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)in_stack_ffffffffffffbd58);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffbd48);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffbd80,
             (char *)CONCAT44(in_stack_ffffffffffffbd7c,in_stack_ffffffffffffbd78),
             (char *)in_stack_ffffffffffffbd70,in_stack_ffffffffffffbd6c,
             SUB41((uint)in_stack_ffffffffffffbd68 >> 0x18,0));
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffbd48);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffbd80,
             (char *)CONCAT44(in_stack_ffffffffffffbd7c,in_stack_ffffffffffffbd78),
             (char *)in_stack_ffffffffffffbd70,in_stack_ffffffffffffbd6c,
             SUB41((uint)in_stack_ffffffffffffbd68 >> 0x18,0));
  TestMemPoolEntryHelper::TestMemPoolEntryHelper
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffbd48);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)in_stack_ffffffffffffbd58,(size_type)in_stack_ffffffffffffbd50);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffbd48);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffbd58,(Txid *)in_stack_ffffffffffffbd50,
             (uint32_t)((ulong)in_stack_ffffffffffffbd48 >> 0x20));
  std::allocator<COutPoint>::allocator((allocator<COutPoint> *)in_stack_ffffffffffffbd48);
  __l._M_len = (size_type)in_stack_ffffffffffffbd98;
  __l._M_array = in_stack_ffffffffffffbd90;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)
             CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),__l,
             (allocator_type *)in_stack_ffffffffffffbd80);
  make_tx(in_stack_ffffffffffffbdb8,CONCAT44(in_stack_ffffffffffffbdb4,in_stack_ffffffffffffbdb0));
  std::vector<COutPoint,_std::allocator<COutPoint>_>::~vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffbd58);
  std::allocator<COutPoint>::~allocator((allocator<COutPoint> *)in_stack_ffffffffffffbd48);
  TestMemPoolEntryHelper::Fee
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffbd58,(CAmount)in_stack_ffffffffffffbd50)
  ;
  TestMemPoolEntryHelper::FromTx
            (in_stack_ffffffffffffbda0,(CTransactionRef *)in_stack_ffffffffffffbd98);
  CTxMemPool::addUnchecked
            ((CTxMemPool *)CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
             in_stack_ffffffffffffbd80);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)in_stack_ffffffffffffbd48);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffbd48);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffbd58,(Txid *)in_stack_ffffffffffffbd50,
             (uint32_t)((ulong)in_stack_ffffffffffffbd48 >> 0x20));
  std::allocator<COutPoint>::allocator((allocator<COutPoint> *)in_stack_ffffffffffffbd48);
  __l_00._M_len = (size_type)in_stack_ffffffffffffbd98;
  __l_00._M_array = in_stack_ffffffffffffbd90;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)
             CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),__l_00,
             (allocator_type *)in_stack_ffffffffffffbd80);
  make_tx(in_stack_ffffffffffffbdb8,CONCAT44(in_stack_ffffffffffffbdb4,in_stack_ffffffffffffbdb0));
  std::vector<COutPoint,_std::allocator<COutPoint>_>::~vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffbd58);
  std::allocator<COutPoint>::~allocator((allocator<COutPoint> *)in_stack_ffffffffffffbd48);
  TestMemPoolEntryHelper::Fee
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffbd58,(CAmount)in_stack_ffffffffffffbd50)
  ;
  TestMemPoolEntryHelper::FromTx
            (in_stack_ffffffffffffbda0,(CTransactionRef *)in_stack_ffffffffffffbd98);
  CTxMemPool::addUnchecked
            ((CTxMemPool *)CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
             in_stack_ffffffffffffbd80);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)in_stack_ffffffffffffbd48);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)in_stack_ffffffffffffbd58,(size_type)in_stack_ffffffffffffbd50);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffbd48);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffbd58,(Txid *)in_stack_ffffffffffffbd50,
             (uint32_t)((ulong)in_stack_ffffffffffffbd48 >> 0x20));
  std::allocator<COutPoint>::allocator((allocator<COutPoint> *)in_stack_ffffffffffffbd48);
  __l_01._M_len = (size_type)in_stack_ffffffffffffbd98;
  __l_01._M_array = in_stack_ffffffffffffbd90;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)
             CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),__l_01,
             (allocator_type *)in_stack_ffffffffffffbd80);
  make_tx(in_stack_ffffffffffffbdb8,CONCAT44(in_stack_ffffffffffffbdb4,in_stack_ffffffffffffbdb0));
  std::vector<COutPoint,_std::allocator<COutPoint>_>::~vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffbd58);
  std::allocator<COutPoint>::~allocator((allocator<COutPoint> *)in_stack_ffffffffffffbd48);
  TestMemPoolEntryHelper::Fee
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffbd58,(CAmount)in_stack_ffffffffffffbd50)
  ;
  TestMemPoolEntryHelper::FromTx
            (in_stack_ffffffffffffbda0,(CTransactionRef *)in_stack_ffffffffffffbd98);
  CTxMemPool::addUnchecked
            ((CTxMemPool *)CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
             in_stack_ffffffffffffbd80);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)in_stack_ffffffffffffbd48);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffbd48);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffbd58,(Txid *)in_stack_ffffffffffffbd50,
             (uint32_t)((ulong)in_stack_ffffffffffffbd48 >> 0x20));
  std::allocator<COutPoint>::allocator((allocator<COutPoint> *)in_stack_ffffffffffffbd48);
  __l_02._M_len = (size_type)in_stack_ffffffffffffbd98;
  __l_02._M_array = in_stack_ffffffffffffbd90;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)
             CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),__l_02,
             (allocator_type *)in_stack_ffffffffffffbd80);
  make_tx(in_stack_ffffffffffffbdb8,CONCAT44(in_stack_ffffffffffffbdb4,in_stack_ffffffffffffbdb0));
  std::vector<COutPoint,_std::allocator<COutPoint>_>::~vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffbd58);
  std::allocator<COutPoint>::~allocator((allocator<COutPoint> *)in_stack_ffffffffffffbd48);
  TestMemPoolEntryHelper::Fee
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffbd58,(CAmount)in_stack_ffffffffffffbd50)
  ;
  TestMemPoolEntryHelper::FromTx
            (in_stack_ffffffffffffbda0,(CTransactionRef *)in_stack_ffffffffffffbd98);
  CTxMemPool::addUnchecked
            ((CTxMemPool *)CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
             in_stack_ffffffffffffbd80);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)in_stack_ffffffffffffbd48);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)in_stack_ffffffffffffbd58,(size_type)in_stack_ffffffffffffbd50);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffbd48);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffbd58,(Txid *)in_stack_ffffffffffffbd50,
             (uint32_t)((ulong)in_stack_ffffffffffffbd48 >> 0x20));
  std::allocator<COutPoint>::allocator((allocator<COutPoint> *)in_stack_ffffffffffffbd48);
  __l_03._M_len = (size_type)in_stack_ffffffffffffbd98;
  __l_03._M_array = in_stack_ffffffffffffbd90;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)
             CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),__l_03,
             (allocator_type *)in_stack_ffffffffffffbd80);
  make_tx(in_stack_ffffffffffffbdb8,CONCAT44(in_stack_ffffffffffffbdb4,in_stack_ffffffffffffbdb0));
  std::vector<COutPoint,_std::allocator<COutPoint>_>::~vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffbd58);
  std::allocator<COutPoint>::~allocator((allocator<COutPoint> *)in_stack_ffffffffffffbd48);
  TestMemPoolEntryHelper::Fee
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffbd58,(CAmount)in_stack_ffffffffffffbd50)
  ;
  TestMemPoolEntryHelper::FromTx
            (in_stack_ffffffffffffbda0,(CTransactionRef *)in_stack_ffffffffffffbd98);
  CTxMemPool::addUnchecked
            ((CTxMemPool *)CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
             in_stack_ffffffffffffbd80);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)in_stack_ffffffffffffbd48);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffbd48);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffbd58,(Txid *)in_stack_ffffffffffffbd50,
             (uint32_t)((ulong)in_stack_ffffffffffffbd48 >> 0x20));
  std::allocator<COutPoint>::allocator((allocator<COutPoint> *)in_stack_ffffffffffffbd48);
  __l_04._M_len = (size_type)in_stack_ffffffffffffbd98;
  __l_04._M_array = in_stack_ffffffffffffbd90;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)
             CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),__l_04,
             (allocator_type *)in_stack_ffffffffffffbd80);
  make_tx(in_stack_ffffffffffffbdb8,CONCAT44(in_stack_ffffffffffffbdb4,in_stack_ffffffffffffbdb0));
  std::vector<COutPoint,_std::allocator<COutPoint>_>::~vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffbd58);
  std::allocator<COutPoint>::~allocator((allocator<COutPoint> *)in_stack_ffffffffffffbd48);
  TestMemPoolEntryHelper::Fee
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffbd58,(CAmount)in_stack_ffffffffffffbd50)
  ;
  TestMemPoolEntryHelper::FromTx
            (in_stack_ffffffffffffbda0,(CTransactionRef *)in_stack_ffffffffffffbd98);
  CTxMemPool::addUnchecked
            ((CTxMemPool *)CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
             in_stack_ffffffffffffbd80);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)in_stack_ffffffffffffbd48);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffbd48);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
  transaction_identifier::operator_cast_to_uint256_
            ((transaction_identifier<false> *)in_stack_ffffffffffffbd48);
  CTxMemPool::PrioritiseTransaction
            (in_stack_ffffffffffffbe18,in_stack_ffffffffffffbe10,in_stack_ffffffffffffbe08);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)in_stack_ffffffffffffbd58,(size_type)in_stack_ffffffffffffbd50);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffbd48);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffbd58,(Txid *)in_stack_ffffffffffffbd50,
             (uint32_t)((ulong)in_stack_ffffffffffffbd48 >> 0x20));
  std::allocator<COutPoint>::allocator((allocator<COutPoint> *)in_stack_ffffffffffffbd48);
  __l_05._M_len = (size_type)in_stack_ffffffffffffbd98;
  __l_05._M_array = in_stack_ffffffffffffbd90;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)
             CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),__l_05,
             (allocator_type *)in_stack_ffffffffffffbd80);
  make_tx(in_stack_ffffffffffffbdb8,CONCAT44(in_stack_ffffffffffffbdb4,in_stack_ffffffffffffbdb0));
  std::vector<COutPoint,_std::allocator<COutPoint>_>::~vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffbd58);
  std::allocator<COutPoint>::~allocator((allocator<COutPoint> *)in_stack_ffffffffffffbd48);
  TestMemPoolEntryHelper::Fee
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffbd58,(CAmount)in_stack_ffffffffffffbd50)
  ;
  TestMemPoolEntryHelper::FromTx
            (in_stack_ffffffffffffbda0,(CTransactionRef *)in_stack_ffffffffffffbd98);
  CTxMemPool::addUnchecked
            ((CTxMemPool *)CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
             in_stack_ffffffffffffbd80);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)in_stack_ffffffffffffbd48);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffbd48);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffbd58,(Txid *)in_stack_ffffffffffffbd50,
             (uint32_t)((ulong)in_stack_ffffffffffffbd48 >> 0x20));
  std::allocator<COutPoint>::allocator((allocator<COutPoint> *)in_stack_ffffffffffffbd48);
  __l_06._M_len = (size_type)in_stack_ffffffffffffbd98;
  __l_06._M_array = in_stack_ffffffffffffbd90;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)
             CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),__l_06,
             (allocator_type *)in_stack_ffffffffffffbd80);
  make_tx(in_stack_ffffffffffffbdb8,CONCAT44(in_stack_ffffffffffffbdb4,in_stack_ffffffffffffbdb0));
  std::vector<COutPoint,_std::allocator<COutPoint>_>::~vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffbd58);
  std::allocator<COutPoint>::~allocator((allocator<COutPoint> *)in_stack_ffffffffffffbd48);
  TestMemPoolEntryHelper::Fee
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffbd58,(CAmount)in_stack_ffffffffffffbd50)
  ;
  TestMemPoolEntryHelper::FromTx
            (in_stack_ffffffffffffbda0,(CTransactionRef *)in_stack_ffffffffffffbd98);
  CTxMemPool::addUnchecked
            ((CTxMemPool *)CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
             in_stack_ffffffffffffbd80);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)in_stack_ffffffffffffbd48);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffbd48);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffbd58,(Txid *)in_stack_ffffffffffffbd50,
             (uint32_t)((ulong)in_stack_ffffffffffffbd48 >> 0x20));
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffbd48);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffbd58,(Txid *)in_stack_ffffffffffffbd50,
             (uint32_t)((ulong)in_stack_ffffffffffffbd48 >> 0x20));
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffbd48);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffbd58,(Txid *)in_stack_ffffffffffffbd50,
             (uint32_t)((ulong)in_stack_ffffffffffffbd48 >> 0x20));
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffbd48);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffbd58,(Txid *)in_stack_ffffffffffffbd50,
             (uint32_t)((ulong)in_stack_ffffffffffffbd48 >> 0x20));
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffbd48);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffbd58,(Txid *)in_stack_ffffffffffffbd50,
             (uint32_t)((ulong)in_stack_ffffffffffffbd48 >> 0x20));
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffbd48);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffbd58,(Txid *)in_stack_ffffffffffffbd50,
             (uint32_t)((ulong)in_stack_ffffffffffffbd48 >> 0x20));
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffbd48);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffbd58,(Txid *)in_stack_ffffffffffffbd50,
             (uint32_t)((ulong)in_stack_ffffffffffffbd48 >> 0x20));
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffbd48);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffbd58,(Txid *)in_stack_ffffffffffffbd50,
             (uint32_t)((ulong)in_stack_ffffffffffffbd48 >> 0x20));
  std::allocator<COutPoint>::allocator((allocator<COutPoint> *)in_stack_ffffffffffffbd48);
  __l_07._M_len = (size_type)in_stack_ffffffffffffbd98;
  __l_07._M_array = in_stack_ffffffffffffbd90;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)
             CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),__l_07,
             (allocator_type *)in_stack_ffffffffffffbd80);
  std::allocator<COutPoint>::~allocator((allocator<COutPoint> *)in_stack_ffffffffffffbd48);
  std::vector<COutPoint,_std::allocator<COutPoint>_>::begin
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffbd50);
  __end1 = std::vector<COutPoint,_std::allocator<COutPoint>_>::end
                     ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffbd50);
  while (bVar1 = __gnu_cxx::
                 operator==<COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
                           ((__normal_iterator<COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
                             *)in_stack_ffffffffffffbd58,
                            (__normal_iterator<COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
                             *)in_stack_ffffffffffffbd50), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::__normal_iterator<COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>::
    operator*((__normal_iterator<COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_> *
              )in_stack_ffffffffffffbd48);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
                 (const_string *)in_stack_ffffffffffffbd80,
                 CONCAT44(in_stack_ffffffffffffbd7c,in_stack_ffffffffffffbd78),
                 (const_string *)in_stack_ffffffffffffbd70);
      CTxMemPool::isSpent((CTxMemPool *)
                          CONCAT44(in_stack_ffffffffffffbd7c,in_stack_ffffffffffffbd78),
                          in_stack_ffffffffffffbd70);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffbd58,
                 SUB81((ulong)in_stack_ffffffffffffbd50 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      boost::unit_test::operator<<
                (in_stack_ffffffffffffbd50,(basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      in_stack_ffffffffffffbd48 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_1ff0,&local_2010,local_2030,0x9a,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffbd48);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffbd48);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    __gnu_cxx::__normal_iterator<COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>::
    operator++((__normal_iterator<COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
                *)in_stack_ffffffffffffbd48);
  }
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffbd48);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffbd58,(Txid *)in_stack_ffffffffffffbd50,
             (uint32_t)((ulong)in_stack_ffffffffffffbd48 >> 0x20));
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffbd48);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffbd58,(Txid *)in_stack_ffffffffffffbd50,
             (uint32_t)((ulong)in_stack_ffffffffffffbd48 >> 0x20));
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffbd48);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffbd58,(Txid *)in_stack_ffffffffffffbd50,
             (uint32_t)((ulong)in_stack_ffffffffffffbd48 >> 0x20));
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffbd48);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffbd58,(Txid *)in_stack_ffffffffffffbd50,
             (uint32_t)((ulong)in_stack_ffffffffffffbd48 >> 0x20));
  std::allocator<COutPoint>::allocator((allocator<COutPoint> *)in_stack_ffffffffffffbd48);
  __l_08._M_len = (size_type)in_stack_ffffffffffffbd98;
  __l_08._M_array = in_stack_ffffffffffffbd90;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)
             CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),__l_08,
             (allocator_type *)in_stack_ffffffffffffbd80);
  std::allocator<COutPoint>::~allocator((allocator<COutPoint> *)in_stack_ffffffffffffbd48);
  std::vector<COutPoint,_std::allocator<COutPoint>_>::begin
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffbd50);
  __end1_1 = std::vector<COutPoint,_std::allocator<COutPoint>_>::end
                       ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffbd50);
  while (bVar1 = __gnu_cxx::
                 operator==<COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
                           ((__normal_iterator<COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
                             *)in_stack_ffffffffffffbd58,
                            (__normal_iterator<COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
                             *)in_stack_ffffffffffffbd50), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::__normal_iterator<COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>::
    operator*((__normal_iterator<COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_> *
              )in_stack_ffffffffffffbd48);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
                 (const_string *)in_stack_ffffffffffffbd80,
                 CONCAT44(in_stack_ffffffffffffbd7c,in_stack_ffffffffffffbd78),
                 (const_string *)in_stack_ffffffffffffbd70);
      CTxMemPool::GetConflictTx
                ((CTxMemPool *)CONCAT44(in_stack_ffffffffffffbd6c,in_stack_ffffffffffffbd68),
                 (COutPoint *)CONCAT44(in_stack_ffffffffffffbd64,in_stack_ffffffffffffbd60));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffbd58,
                 SUB81((ulong)in_stack_ffffffffffffbd50 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      boost::unit_test::operator<<
                (in_stack_ffffffffffffbd50,(basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      in_stack_ffffffffffffbd48 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_2098,local_20b8,local_20d8,0xa2,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffbd48);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffbd48);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    __gnu_cxx::__normal_iterator<COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>::
    operator++((__normal_iterator<COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
                *)in_stack_ffffffffffffbd48);
  }
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffbd48);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffbd58,(Txid *)in_stack_ffffffffffffbd50,
             (uint32_t)((ulong)in_stack_ffffffffffffbd48 >> 0x20));
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffbd48);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffbd58,(Txid *)in_stack_ffffffffffffbd50,
             (uint32_t)((ulong)in_stack_ffffffffffffbd48 >> 0x20));
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffbd48);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffbd58,(Txid *)in_stack_ffffffffffffbd50,
             (uint32_t)((ulong)in_stack_ffffffffffffbd48 >> 0x20));
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffbd48);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffbd58,(Txid *)in_stack_ffffffffffffbd50,
             (uint32_t)((ulong)in_stack_ffffffffffffbd48 >> 0x20));
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffbd48);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffbd58,(Txid *)in_stack_ffffffffffffbd50,
             (uint32_t)((ulong)in_stack_ffffffffffffbd48 >> 0x20));
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffbd48);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffbd58,(Txid *)in_stack_ffffffffffffbd50,
             (uint32_t)((ulong)in_stack_ffffffffffffbd48 >> 0x20));
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffbd48);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffbd58,(Txid *)in_stack_ffffffffffffbd50,
             (uint32_t)((ulong)in_stack_ffffffffffffbd48 >> 0x20));
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffbd48);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffbd58,(Txid *)in_stack_ffffffffffffbd50,
             (uint32_t)((ulong)in_stack_ffffffffffffbd48 >> 0x20));
  std::allocator<COutPoint>::allocator((allocator<COutPoint> *)in_stack_ffffffffffffbd48);
  __l_09._M_len = (size_type)in_stack_ffffffffffffbd98;
  __l_09._M_array = in_stack_ffffffffffffbd90;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)
             CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),__l_09,
             (allocator_type *)in_stack_ffffffffffffbd80);
  std::allocator<COutPoint>::~allocator((allocator<COutPoint> *)in_stack_ffffffffffffbd48);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffbd48,
             (shared_ptr<const_CTransaction> *)0x752cd2);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffbd48,
             (shared_ptr<const_CTransaction> *)0x752ce7);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffbd48,
             (shared_ptr<const_CTransaction> *)0x752cfc);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffbd48,
             (shared_ptr<const_CTransaction> *)0x752d11);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffbd48,
             (shared_ptr<const_CTransaction> *)0x752d26);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffbd48,
             (shared_ptr<const_CTransaction> *)0x752d3b);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffbd48,
             (shared_ptr<const_CTransaction> *)0x752d50);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffbd48,
             (shared_ptr<const_CTransaction> *)0x752d65);
  std::allocator<std::shared_ptr<const_CTransaction>_>::allocator
            ((allocator<std::shared_ptr<const_CTransaction>_> *)in_stack_ffffffffffffbd48);
  __l_10._M_len = (size_type)in_stack_ffffffffffffbd98;
  __l_10._M_array = (iterator)in_stack_ffffffffffffbd90;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),__l_10,
           (allocator_type *)in_stack_ffffffffffffbd80);
  std::allocator<std::shared_ptr<const_CTransaction>_>::~allocator
            ((allocator<std::shared_ptr<const_CTransaction>_> *)in_stack_ffffffffffffbd48);
  local_38c0 = local_c98;
  do {
    local_38c0 = local_38c0 + -0x10;
    std::shared_ptr<const_CTransaction>::~shared_ptr
              ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffbd48);
  } while (local_38c0 != local_d18);
  std::
  map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
  ::map((map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
         *)in_stack_ffffffffffffbd48);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::begin((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *)in_stack_ffffffffffffbd50);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::end((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
         *)in_stack_ffffffffffffbd50);
  while (bVar1 = __gnu_cxx::
                 operator==<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                           ((__normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                             *)in_stack_ffffffffffffbd58,
                            (__normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                             *)in_stack_ffffffffffffbd50), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
    ::operator*((__normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                 *)in_stack_ffffffffffffbd48);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffbd48);
    CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
    CTxMemPool::GetEntry
              ((CTxMemPool *)CONCAT44(in_stack_ffffffffffffbd6c,in_stack_ffffffffffffbd68),
               (Txid *)CONCAT44(in_stack_ffffffffffffbd64,in_stack_ffffffffffffbd60));
    inline_assertion_check<true,CTxMemPoolEntry_const*>
              ((CTxMemPoolEntry **)CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
               (char *)in_stack_ffffffffffffbd80,in_stack_ffffffffffffbd7c,
               (char *)in_stack_ffffffffffffbd70,
               (char *)CONCAT44(in_stack_ffffffffffffbd6c,in_stack_ffffffffffffbd68));
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffbd48);
    CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
    CTxMemPoolEntry::GetTxSize((CTxMemPoolEntry *)in_stack_ffffffffffffbd48);
    CTxMemPoolEntry::GetModifiedFee((CTxMemPoolEntry *)in_stack_ffffffffffffbd48);
    CTxMemPoolEntry::GetModifiedFee((CTxMemPoolEntry *)in_stack_ffffffffffffbd48);
    CTxMemPoolEntry::GetTxSize((CTxMemPoolEntry *)in_stack_ffffffffffffbd48);
    CFeeRate::CFeeRate((CFeeRate *)CONCAT44(in_stack_ffffffffffffbd6c,in_stack_ffffffffffffbd68),
                       (CAmount *)CONCAT44(in_stack_ffffffffffffbd64,in_stack_ffffffffffffbd60),
                       (uint32_t)((ulong)in_stack_ffffffffffffbd58 >> 0x20));
    std::
    map<uint256,miniminer_tests::miniminer_1p1c::test_method()::TxDimensions,std::less<uint256>,std::allocator<std::pair<uint256_const,miniminer_tests::miniminer_1p1c::test_method()::TxDimensions>>>
    ::
    emplace<transaction_identifier<false>const&,miniminer_tests::miniminer_1p1c::test_method()::TxDimensions>
              ((map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
                *)CONCAT44(in_stack_ffffffffffffbd6c,in_stack_ffffffffffffbd68),
               (transaction_identifier<false> *)
               CONCAT44(in_stack_ffffffffffffbd64,in_stack_ffffffffffffbd60),
               (TxDimensions *)in_stack_ffffffffffffbd58);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
    ::operator++((__normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                  *)in_stack_ffffffffffffbd48);
  }
  CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_ffffffffffffbd48,0);
  CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_ffffffffffffbd48,0);
  CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_ffffffffffffbd48,0);
  CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_ffffffffffffbd48,0);
  CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_ffffffffffffbd48,0);
  CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_ffffffffffffbd48,0);
  CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_ffffffffffffbd48,0);
  CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_ffffffffffffbd48,0);
  CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_ffffffffffffbd48,0);
  CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_ffffffffffffbd48,0);
  CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_ffffffffffffbd48,0);
  CFeeRate::CFeeRate<long>((CFeeRate *)in_stack_ffffffffffffbd48,0x753245);
  std::allocator<CFeeRate>::allocator((allocator<CFeeRate> *)in_stack_ffffffffffffbd48);
  __l_11._M_len = (size_type)in_stack_ffffffffffffbd98;
  __l_11._M_array = (iterator)in_stack_ffffffffffffbd90;
  std::vector<CFeeRate,_std::allocator<CFeeRate>_>::vector
            ((vector<CFeeRate,_std::allocator<CFeeRate>_> *)
             CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),__l_11,
             (allocator_type *)in_stack_ffffffffffffbd80);
  std::allocator<CFeeRate>::~allocator((allocator<CFeeRate> *)in_stack_ffffffffffffbd48);
  GetRandHash();
  transaction_identifier<false>::FromUint256((uint256 *)in_stack_ffffffffffffbd48);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffbd58,(Txid *)in_stack_ffffffffffffbd50,
             (uint32_t)((ulong)in_stack_ffffffffffffbd48 >> 0x20));
  GetRandHash();
  transaction_identifier<false>::FromUint256((uint256 *)in_stack_ffffffffffffbd48);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_ffffffffffffbd58,(Txid *)in_stack_ffffffffffffbd50,
             (uint32_t)((ulong)in_stack_ffffffffffffbd48 >> 0x20));
  std::allocator<COutPoint>::allocator((allocator<COutPoint> *)in_stack_ffffffffffffbd48);
  __l_12._M_len = (size_type)in_stack_ffffffffffffbd98;
  __l_12._M_array = in_stack_ffffffffffffbd90;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)
             CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),__l_12,
             (allocator_type *)in_stack_ffffffffffffbd80);
  std::allocator<COutPoint>::~allocator((allocator<COutPoint> *)in_stack_ffffffffffffbd48);
  std::vector<COutPoint,_std::allocator<COutPoint>_>::begin
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffbd50);
  __end1_3 = std::vector<COutPoint,_std::allocator<COutPoint>_>::end
                       ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffbd50);
  while (bVar1 = __gnu_cxx::
                 operator==<COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
                           ((__normal_iterator<COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
                             *)in_stack_ffffffffffffbd58,
                            (__normal_iterator<COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
                             *)in_stack_ffffffffffffbd50), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::__normal_iterator<COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>::
    operator*((__normal_iterator<COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_> *
              )in_stack_ffffffffffffbd48);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
                 (const_string *)in_stack_ffffffffffffbd80,
                 CONCAT44(in_stack_ffffffffffffbd7c,in_stack_ffffffffffffbd78),
                 (const_string *)in_stack_ffffffffffffbd70);
      CTxMemPool::isSpent((CTxMemPool *)
                          CONCAT44(in_stack_ffffffffffffbd7c,in_stack_ffffffffffffbd78),
                          in_stack_ffffffffffffbd70);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffbd58,
                 SUB81((ulong)in_stack_ffffffffffffbd50 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      boost::unit_test::operator<<
                (in_stack_ffffffffffffbd50,(basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      in_stack_ffffffffffffbd48 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_21d8,local_21f8,local_2218,0xc2,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffbd48);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffbd48);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    __gnu_cxx::__normal_iterator<COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>::
    operator++((__normal_iterator<COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
                *)in_stack_ffffffffffffbd48);
  }
  std::vector<CFeeRate,_std::allocator<CFeeRate>_>::begin
            ((vector<CFeeRate,_std::allocator<CFeeRate>_> *)in_stack_ffffffffffffbd50);
  __end1_4 = std::vector<CFeeRate,_std::allocator<CFeeRate>_>::end
                       ((vector<CFeeRate,_std::allocator<CFeeRate>_> *)in_stack_ffffffffffffbd50);
  while (bVar1 = __gnu_cxx::
                 operator==<const_CFeeRate_*,_std::vector<CFeeRate,_std::allocator<CFeeRate>_>_>
                           ((__normal_iterator<const_CFeeRate_*,_std::vector<CFeeRate,_std::allocator<CFeeRate>_>_>
                             *)in_stack_ffffffffffffbd58,
                            (__normal_iterator<const_CFeeRate_*,_std::vector<CFeeRate,_std::allocator<CFeeRate>_>_>
                             *)in_stack_ffffffffffffbd50), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<const_CFeeRate_*,_std::vector<CFeeRate,_std::allocator<CFeeRate>_>_>::
    operator*((__normal_iterator<const_CFeeRate_*,_std::vector<CFeeRate,_std::allocator<CFeeRate>_>_>
               *)in_stack_ffffffffffffbd48);
    ::node::MiniMiner::MiniMiner
              (in_stack_ffffffffffffc0d8,in_stack_ffffffffffffc0d0,in_stack_ffffffffffffc0c8);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
                 (const_string *)in_stack_ffffffffffffbd80,
                 CONCAT44(in_stack_ffffffffffffbd7c,in_stack_ffffffffffffbd78),
                 (const_string *)in_stack_ffffffffffffbd70);
      ::node::MiniMiner::IsReadyToCalculate((MiniMiner *)in_stack_ffffffffffffbd48);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffbd58,
                 SUB81((ulong)in_stack_ffffffffffffbd50 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      boost::unit_test::operator<<
                (in_stack_ffffffffffffbd50,(basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      in_stack_ffffffffffffbd48 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_2260,local_2280,local_22a0,0xc5,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffbd48);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffbd48);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    ::node::MiniMiner::CalculateBumpFees
              (in_stack_ffffffffffffbde8,(CFeeRate *)in_stack_ffffffffffffbde0);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
                 (const_string *)in_stack_ffffffffffffbd80,
                 CONCAT44(in_stack_ffffffffffffbd7c,in_stack_ffffffffffffbd78),
                 (const_string *)in_stack_ffffffffffffbd70);
      ::node::MiniMiner::IsReadyToCalculate((MiniMiner *)in_stack_ffffffffffffbd48);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffbd58,
                 SUB81((ulong)in_stack_ffffffffffffbd50 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      boost::unit_test::operator<<
                (in_stack_ffffffffffffbd50,(basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      in_stack_ffffffffffffbd48 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_22d8,local_22f8,local_2318,199,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffbd48);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffbd48);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
                 (const_string *)in_stack_ffffffffffffbd80,
                 CONCAT44(in_stack_ffffffffffffbd7c,in_stack_ffffffffffffbd78),
                 (const_string *)in_stack_ffffffffffffbd70);
      sanity_check(in_stack_ffffffffffffbde0,
                   (map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                    *)CONCAT44(in_stack_ffffffffffffbddc,in_stack_ffffffffffffbdd8));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffbd58,
                 SUB81((ulong)in_stack_ffffffffffffbd50 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      boost::unit_test::operator<<
                (in_stack_ffffffffffffbd50,(basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      in_stack_ffffffffffffbd48 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_2350,local_2370,local_2390,200,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffbd48);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffbd48);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
                 (const_string *)in_stack_ffffffffffffbd80,
                 CONCAT44(in_stack_ffffffffffffbd7c,in_stack_ffffffffffffbd78),
                 (const_string *)in_stack_ffffffffffffbd70);
      std::
      map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
      ::size((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
              *)in_stack_ffffffffffffbd48);
      std::vector<COutPoint,_std::allocator<COutPoint>_>::size
                ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffbd48);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffbd58,
                 SUB81((ulong)in_stack_ffffffffffffbd50 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      boost::unit_test::operator<<
                (in_stack_ffffffffffffbd50,(basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      in_stack_ffffffffffffbd48 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_23c8,local_23e8,local_2408,0xc9,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffbd48);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffbd48);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    std::vector<COutPoint,_std::allocator<COutPoint>_>::begin
              ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffbd50);
    std::vector<COutPoint,_std::allocator<COutPoint>_>::end
              ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffbd50);
    while (bVar1 = __gnu_cxx::
                   operator==<COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
                             ((__normal_iterator<COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
                               *)in_stack_ffffffffffffbd58,
                              (__normal_iterator<COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
                               *)in_stack_ffffffffffffbd50), ((bVar1 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::__normal_iterator<COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
      ::operator*((__normal_iterator<COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
                   *)in_stack_ffffffffffffbd48);
      it = std::
           map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
           ::find((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                   *)in_stack_ffffffffffffbd50,(key_type *)in_stack_ffffffffffffbd48);
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                   (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
                   (const_string *)in_stack_ffffffffffffbd80,
                   CONCAT44(in_stack_ffffffffffffbd7c,in_stack_ffffffffffffbd78),
                   (const_string *)in_stack_ffffffffffffbd70);
        local_2460 = (_Base_ptr)
                     std::
                     map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                     ::end((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                            *)in_stack_ffffffffffffbd50);
        std::operator==((_Self *)in_stack_ffffffffffffbd58,(_Self *)in_stack_ffffffffffffbd50);
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)in_stack_ffffffffffffbd58,
                   SUB81((ulong)in_stack_ffffffffffffbd50 >> 0x38,0));
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                   (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
        boost::unit_test::operator<<
                  (in_stack_ffffffffffffbd50,(basic_cstring<const_char> *)in_stack_ffffffffffffbd48)
        ;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                   (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
        in_stack_ffffffffffffbd48 = (char *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (local_2458,local_2480,local_24a0,0xcc,CHECK,CHECK_PRED);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                    *)in_stack_ffffffffffffbd48);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_ffffffffffffbd48);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                   (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
                   (const_string *)in_stack_ffffffffffffbd80,
                   CONCAT44(in_stack_ffffffffffffbd7c,in_stack_ffffffffffffbd78),
                   (const_string *)in_stack_ffffffffffffbd70);
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::operator<<
                  (in_stack_ffffffffffffbd50,(char (*) [1])in_stack_ffffffffffffbd48);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                   (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
        std::_Rb_tree_iterator<std::pair<const_COutPoint,_long>_>::operator->
                  ((_Rb_tree_iterator<std::pair<const_COutPoint,_long>_> *)in_stack_ffffffffffffbd48
                  );
        local_24f4._vptr_lazy_ostream._0_4_ = 0;
        in_stack_ffffffffffffbd58 = "0";
        in_stack_ffffffffffffbd50 = &local_24f4;
        in_stack_ffffffffffffbd48 = "it->second";
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
                  (local_24e0,(undefined1 *)((long)&local_24f4._vptr_lazy_ostream + 4),0xcd,1,2);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
        ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                            *)in_stack_ffffffffffffbd48);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
      __gnu_cxx::__normal_iterator<COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
      ::operator++((__normal_iterator<COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
                    *)in_stack_ffffffffffffbd48);
    }
    std::
    map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>::
    ~map((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
          *)in_stack_ffffffffffffbd48);
    ::node::MiniMiner::~MiniMiner((MiniMiner *)in_stack_ffffffffffffbd48);
    __gnu_cxx::
    __normal_iterator<const_CFeeRate_*,_std::vector<CFeeRate,_std::allocator<CFeeRate>_>_>::
    operator++((__normal_iterator<const_CFeeRate_*,_std::vector<CFeeRate,_std::allocator<CFeeRate>_>_>
                *)in_stack_ffffffffffffbd48);
  }
  std::vector<CFeeRate,_std::allocator<CFeeRate>_>::begin
            ((vector<CFeeRate,_std::allocator<CFeeRate>_> *)in_stack_ffffffffffffbd50);
  __end1_5 = std::vector<CFeeRate,_std::allocator<CFeeRate>_>::end
                       ((vector<CFeeRate,_std::allocator<CFeeRate>_> *)in_stack_ffffffffffffbd50);
  while (bVar1 = __gnu_cxx::
                 operator==<const_CFeeRate_*,_std::vector<CFeeRate,_std::allocator<CFeeRate>_>_>
                           ((__normal_iterator<const_CFeeRate_*,_std::vector<CFeeRate,_std::allocator<CFeeRate>_>_>
                             *)in_stack_ffffffffffffbd58,
                            (__normal_iterator<const_CFeeRate_*,_std::vector<CFeeRate,_std::allocator<CFeeRate>_>_>
                             *)in_stack_ffffffffffffbd50), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<const_CFeeRate_*,_std::vector<CFeeRate,_std::allocator<CFeeRate>_>_>::
    operator*((__normal_iterator<const_CFeeRate_*,_std::vector<CFeeRate,_std::allocator<CFeeRate>_>_>
               *)in_stack_ffffffffffffbd48);
    ::node::MiniMiner::MiniMiner
              (in_stack_ffffffffffffc0d8,in_stack_ffffffffffffc0d0,in_stack_ffffffffffffc0c8);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
                 (const_string *)in_stack_ffffffffffffbd80,
                 CONCAT44(in_stack_ffffffffffffbd7c,in_stack_ffffffffffffbd78),
                 (const_string *)in_stack_ffffffffffffbd70);
      ::node::MiniMiner::IsReadyToCalculate((MiniMiner *)in_stack_ffffffffffffbd48);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffbd58,
                 SUB81((ulong)in_stack_ffffffffffffbd50 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      boost::unit_test::operator<<
                (in_stack_ffffffffffffbd50,(basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      in_stack_ffffffffffffbd48 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_2540,local_2560,local_2580,0xd4,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffbd48);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffbd48);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    ::node::MiniMiner::CalculateBumpFees
              (in_stack_ffffffffffffbde8,(CFeeRate *)in_stack_ffffffffffffbde0);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
                 (const_string *)in_stack_ffffffffffffbd80,
                 CONCAT44(in_stack_ffffffffffffbd7c,in_stack_ffffffffffffbd78),
                 (const_string *)in_stack_ffffffffffffbd70);
      ::node::MiniMiner::IsReadyToCalculate((MiniMiner *)in_stack_ffffffffffffbd48);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffbd58,
                 SUB81((ulong)in_stack_ffffffffffffbd50 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      boost::unit_test::operator<<
                (in_stack_ffffffffffffbd50,(basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      in_stack_ffffffffffffbd48 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_25b8,local_25d8,local_25f8,0xd6,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffbd48);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffbd48);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
                 (const_string *)in_stack_ffffffffffffbd80,
                 CONCAT44(in_stack_ffffffffffffbd7c,in_stack_ffffffffffffbd78),
                 (const_string *)in_stack_ffffffffffffbd70);
      sanity_check(in_stack_ffffffffffffbde0,
                   (map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                    *)CONCAT44(in_stack_ffffffffffffbddc,in_stack_ffffffffffffbdd8));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffbd58,
                 SUB81((ulong)in_stack_ffffffffffffbd50 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      boost::unit_test::operator<<
                (in_stack_ffffffffffffbd50,(basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      in_stack_ffffffffffffbd48 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_2630,local_2650,local_2670,0xd7,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffbd48);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffbd48);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
                 (const_string *)in_stack_ffffffffffffbd80,
                 CONCAT44(in_stack_ffffffffffffbd7c,in_stack_ffffffffffffbd78),
                 (const_string *)in_stack_ffffffffffffbd70);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (in_stack_ffffffffffffbd50,(char (*) [1])in_stack_ffffffffffffbd48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      local_26d0._8_8_ =
           std::
           map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
           ::size((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                   *)in_stack_ffffffffffffbd48);
      local_26d0._vptr_lazy_ostream =
           (_func_int **)
           std::vector<COutPoint,_std::allocator<COutPoint>_>::size
                     ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffbd48);
      in_stack_ffffffffffffbd58 = "all_unspent_outpoints.size()";
      in_stack_ffffffffffffbd50 = &local_26d0;
      in_stack_ffffffffffffbd48 = "bump_fees.size()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
                (local_26b0,local_26c0,0xd8,1,2,&local_26d0.m_empty);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_ffffffffffffbd48);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffbd48);
    CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
    transaction_identifier::operator_cast_to_uint256_
              ((transaction_identifier<false> *)in_stack_ffffffffffffbd48);
    local_26d8 = (_Base_ptr)
                 std::
                 map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
                 ::find((map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
                         *)in_stack_ffffffffffffbd50,(key_type *)in_stack_ffffffffffffbd48);
    ppVar4 = std::_Rb_tree_iterator<std::pair<const_uint256,_TxDimensions>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_uint256,_TxDimensions>_> *)
                        in_stack_ffffffffffffbd48);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffbd48);
    CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
    COutPoint::COutPoint
              ((COutPoint *)in_stack_ffffffffffffbd58,(Txid *)in_stack_ffffffffffffbd50,
               (uint32_t)((ulong)in_stack_ffffffffffffbd48 >> 0x20));
    bumpfee0 = Find<COutPoint,long>
                         ((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                           *)in_stack_ffffffffffffbd90,
                          (COutPoint *)CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88)
                         );
    bVar1 = operator<=((CFeeRate *)in_stack_ffffffffffffbd58,(CFeeRate *)in_stack_ffffffffffffbd50);
    if (bVar1) {
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                   (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
                   (const_string *)in_stack_ffffffffffffbd80,
                   CONCAT44(in_stack_ffffffffffffbd7c,in_stack_ffffffffffffbd78),
                   (const_string *)in_stack_ffffffffffffbd70);
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::operator<<
                  (in_stack_ffffffffffffbd50,(char (*) [1])in_stack_ffffffffffffbd48);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                   (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
        local_2734._vptr_lazy_ostream._0_4_ = 0;
        in_stack_ffffffffffffbd58 = "0";
        in_stack_ffffffffffffbd50 = &local_2734;
        in_stack_ffffffffffffbd48 = "bumpfee0";
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
                  (local_2720,(undefined1 *)((long)&local_2734._vptr_lazy_ostream + 4),0xde,1,2,
                   &bumpfee0);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
        ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                            *)in_stack_ffffffffffffbd48);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
    }
    else {
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                   (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
                   (const_string *)in_stack_ffffffffffffbd80,
                   CONCAT44(in_stack_ffffffffffffbd7c,in_stack_ffffffffffffbd78),
                   (const_string *)in_stack_ffffffffffffbd70);
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::operator<<
                  (in_stack_ffffffffffffbd50,(char (*) [1])in_stack_ffffffffffffbd48);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                   (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
        CVar5 = CFeeRate::GetFee((CFeeRate *)
                                 CONCAT44(in_stack_ffffffffffffbd6c,in_stack_ffffffffffffbd68),
                                 in_stack_ffffffffffffbd64);
        local_2790._vptr_lazy_ostream = (_func_int **)(CVar5 - (ppVar4->second).mod_fee);
        in_stack_ffffffffffffbd58 =
             "target_feerate.GetFee(tx0_dimensions.vsize) - tx0_dimensions.mod_fee";
        in_stack_ffffffffffffbd50 = &local_2790;
        in_stack_ffffffffffffbd48 = "bumpfee0";
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                  (local_2778,&local_2790.m_empty,0xe1,1,2,&bumpfee0);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
        ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                            *)in_stack_ffffffffffffbd48);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
    }
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffbd48);
    CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
    transaction_identifier::operator_cast_to_uint256_
              ((transaction_identifier<false> *)in_stack_ffffffffffffbd48);
    std::
    map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
    ::find((map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
            *)in_stack_ffffffffffffbd50,(key_type *)in_stack_ffffffffffffbd48);
    ppVar4 = std::_Rb_tree_iterator<std::pair<const_uint256,_TxDimensions>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_uint256,_TxDimensions>_> *)
                        in_stack_ffffffffffffbd48);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffbd48);
    CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
    transaction_identifier::operator_cast_to_uint256_
              ((transaction_identifier<false> *)in_stack_ffffffffffffbd48);
    std::
    map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
    ::find((map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
            *)in_stack_ffffffffffffbd50,(key_type *)in_stack_ffffffffffffbd48);
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_uint256,_TxDimensions>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_uint256,_TxDimensions>_> *)
                        in_stack_ffffffffffffbd48);
    local_27b0 = (ppVar4->second).mod_fee + (ppVar2->second).mod_fee;
    CFeeRate::CFeeRate((CFeeRate *)CONCAT44(in_stack_ffffffffffffbd6c,in_stack_ffffffffffffbd68),
                       (CAmount *)CONCAT44(in_stack_ffffffffffffbd64,in_stack_ffffffffffffbd60),
                       (uint32_t)((ulong)in_stack_ffffffffffffbd58 >> 0x20));
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffbd48);
    CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
    COutPoint::COutPoint
              ((COutPoint *)in_stack_ffffffffffffbd58,(Txid *)in_stack_ffffffffffffbd50,
               (uint32_t)((ulong)in_stack_ffffffffffffbd48 >> 0x20));
    bumpfee2 = Find<COutPoint,long>
                         ((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                           *)in_stack_ffffffffffffbd90,
                          (COutPoint *)CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88)
                         );
    bVar1 = operator<=((CFeeRate *)in_stack_ffffffffffffbd58,(CFeeRate *)in_stack_ffffffffffffbd50);
    if (bVar1) {
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                   (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
                   (const_string *)in_stack_ffffffffffffbd80,
                   CONCAT44(in_stack_ffffffffffffbd7c,in_stack_ffffffffffffbd78),
                   (const_string *)in_stack_ffffffffffffbd70);
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::operator<<
                  (in_stack_ffffffffffffbd50,(char (*) [1])in_stack_ffffffffffffbd48);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                   (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
        local_280c._vptr_lazy_ostream._0_4_ = 0;
        in_stack_ffffffffffffbd58 = "0";
        in_stack_ffffffffffffbd50 = &local_280c;
        in_stack_ffffffffffffbd48 = "bumpfee2";
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
                  (local_27f8,(undefined1 *)((long)&local_280c._vptr_lazy_ostream + 4),0xeb,1,2,
                   &bumpfee2);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
        ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                            *)in_stack_ffffffffffffbd48);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
    }
    else {
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                   (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
                   (const_string *)in_stack_ffffffffffffbd80,
                   CONCAT44(in_stack_ffffffffffffbd7c,in_stack_ffffffffffffbd78),
                   (const_string *)in_stack_ffffffffffffbd70);
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::operator<<
                  (in_stack_ffffffffffffbd50,(char (*) [1])in_stack_ffffffffffffbd48);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                   (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
        CVar5 = CFeeRate::GetFee((CFeeRate *)
                                 CONCAT44(in_stack_ffffffffffffbd6c,in_stack_ffffffffffffbd68),
                                 in_stack_ffffffffffffbd64);
        local_2868._vptr_lazy_ostream = (_func_int **)(CVar5 - (ppVar4->second).mod_fee);
        in_stack_ffffffffffffbd58 =
             "target_feerate.GetFee(tx2_dimensions.vsize) - tx2_dimensions.mod_fee";
        in_stack_ffffffffffffbd50 = &local_2868;
        in_stack_ffffffffffffbd48 = "bumpfee2";
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                  (local_2850,&local_2868.m_empty,0xee,1,2,&bumpfee2);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
        ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                            *)in_stack_ffffffffffffbd48);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
    }
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffbd48);
    CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
    transaction_identifier::operator_cast_to_uint256_
              ((transaction_identifier<false> *)in_stack_ffffffffffffbd48);
    std::
    map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
    ::find((map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
            *)in_stack_ffffffffffffbd50,(key_type *)in_stack_ffffffffffffbd48);
    ppVar4 = std::_Rb_tree_iterator<std::pair<const_uint256,_TxDimensions>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_uint256,_TxDimensions>_> *)
                        in_stack_ffffffffffffbd48);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffbd48);
    CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
    transaction_identifier::operator_cast_to_uint256_
              ((transaction_identifier<false> *)in_stack_ffffffffffffbd48);
    std::
    map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
    ::find((map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
            *)in_stack_ffffffffffffbd50,(key_type *)in_stack_ffffffffffffbd48);
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_uint256,_TxDimensions>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_uint256,_TxDimensions>_> *)
                        in_stack_ffffffffffffbd48);
    local_2888 = (ppVar4->second).mod_fee + (ppVar2->second).mod_fee;
    CFeeRate::CFeeRate((CFeeRate *)CONCAT44(in_stack_ffffffffffffbd6c,in_stack_ffffffffffffbd68),
                       (CAmount *)CONCAT44(in_stack_ffffffffffffbd64,in_stack_ffffffffffffbd60),
                       (uint32_t)((ulong)in_stack_ffffffffffffbd58 >> 0x20));
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffbd48);
    CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
    COutPoint::COutPoint
              ((COutPoint *)in_stack_ffffffffffffbd58,(Txid *)in_stack_ffffffffffffbd50,
               (uint32_t)((ulong)in_stack_ffffffffffffbd48 >> 0x20));
    bumpfee4 = Find<COutPoint,long>
                         ((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                           *)in_stack_ffffffffffffbd90,
                          (COutPoint *)CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88)
                         );
    bVar1 = operator<=((CFeeRate *)in_stack_ffffffffffffbd58,(CFeeRate *)in_stack_ffffffffffffbd50);
    if (bVar1) {
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                   (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
                   (const_string *)in_stack_ffffffffffffbd80,
                   CONCAT44(in_stack_ffffffffffffbd7c,in_stack_ffffffffffffbd78),
                   (const_string *)in_stack_ffffffffffffbd70);
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::operator<<
                  (in_stack_ffffffffffffbd50,(char (*) [1])in_stack_ffffffffffffbd48);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                   (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
        local_28e4._vptr_lazy_ostream._0_4_ = 0;
        in_stack_ffffffffffffbd58 = "0";
        in_stack_ffffffffffffbd50 = &local_28e4;
        in_stack_ffffffffffffbd48 = "bumpfee4";
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
                  (local_28d0,(undefined1 *)((long)&local_28e4._vptr_lazy_ostream + 4),0xff,1,2);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
        ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                            *)in_stack_ffffffffffffbd48);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
    }
    else {
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                   (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
                   (const_string *)in_stack_ffffffffffffbd80,
                   CONCAT44(in_stack_ffffffffffffbd7c,in_stack_ffffffffffffbd78),
                   (const_string *)in_stack_ffffffffffffbd70);
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::operator<<
                  (in_stack_ffffffffffffbd50,(char (*) [1])in_stack_ffffffffffffbd48);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                   (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
        CVar5 = CFeeRate::GetFee((CFeeRate *)
                                 CONCAT44(in_stack_ffffffffffffbd6c,in_stack_ffffffffffffbd68),
                                 in_stack_ffffffffffffbd64);
        local_2940._vptr_lazy_ostream = (_func_int **)(CVar5 - (ppVar4->second).mod_fee);
        in_stack_ffffffffffffbd58 =
             "target_feerate.GetFee(tx4_dimensions.vsize) - tx4_dimensions.mod_fee";
        in_stack_ffffffffffffbd50 = &local_2940;
        in_stack_ffffffffffffbd48 = "bumpfee4";
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                  (local_2928,&local_2940.m_empty,0x102,1,2);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
        ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                            *)in_stack_ffffffffffffbd48);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
    }
    std::
    map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>::
    ~map((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
          *)in_stack_ffffffffffffbd48);
    ::node::MiniMiner::~MiniMiner((MiniMiner *)in_stack_ffffffffffffbd48);
    __gnu_cxx::
    __normal_iterator<const_CFeeRate_*,_std::vector<CFeeRate,_std::allocator<CFeeRate>_>_>::
    operator++((__normal_iterator<const_CFeeRate_*,_std::vector<CFeeRate,_std::allocator<CFeeRate>_>_>
                *)in_stack_ffffffffffffbd48);
  }
  std::vector<CFeeRate,_std::allocator<CFeeRate>_>::begin
            ((vector<CFeeRate,_std::allocator<CFeeRate>_> *)in_stack_ffffffffffffbd50);
  __end1_6 = std::vector<CFeeRate,_std::allocator<CFeeRate>_>::end
                       ((vector<CFeeRate,_std::allocator<CFeeRate>_> *)in_stack_ffffffffffffbd50);
  while (bVar1 = __gnu_cxx::
                 operator==<const_CFeeRate_*,_std::vector<CFeeRate,_std::allocator<CFeeRate>_>_>
                           ((__normal_iterator<const_CFeeRate_*,_std::vector<CFeeRate,_std::allocator<CFeeRate>_>_>
                             *)in_stack_ffffffffffffbd58,
                            (__normal_iterator<const_CFeeRate_*,_std::vector<CFeeRate,_std::allocator<CFeeRate>_>_>
                             *)in_stack_ffffffffffffbd50), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<const_CFeeRate_*,_std::vector<CFeeRate,_std::allocator<CFeeRate>_>_>::
    operator*((__normal_iterator<const_CFeeRate_*,_std::vector<CFeeRate,_std::allocator<CFeeRate>_>_>
               *)in_stack_ffffffffffffbd48);
    ::node::MiniMiner::MiniMiner
              (in_stack_ffffffffffffc0d8,in_stack_ffffffffffffc0d0,in_stack_ffffffffffffc0c8);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
                 (const_string *)in_stack_ffffffffffffbd80,
                 CONCAT44(in_stack_ffffffffffffbd7c,in_stack_ffffffffffffbd78),
                 (const_string *)in_stack_ffffffffffffbd70);
      ::node::MiniMiner::IsReadyToCalculate((MiniMiner *)in_stack_ffffffffffffbd48);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffbd58,
                 SUB81((ulong)in_stack_ffffffffffffbd50 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      boost::unit_test::operator<<
                (in_stack_ffffffffffffbd50,(basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      in_stack_ffffffffffffbd48 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_2988,local_29a8,local_29c8,0x10a,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffbd48);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffbd48);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    ::node::MiniMiner::CalculateBumpFees
              (in_stack_ffffffffffffbde8,(CFeeRate *)in_stack_ffffffffffffbde0);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
                 (const_string *)in_stack_ffffffffffffbd80,
                 CONCAT44(in_stack_ffffffffffffbd7c,in_stack_ffffffffffffbd78),
                 (const_string *)in_stack_ffffffffffffbd70);
      ::node::MiniMiner::IsReadyToCalculate((MiniMiner *)in_stack_ffffffffffffbd48);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffbd58,
                 SUB81((ulong)in_stack_ffffffffffffbd50 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      boost::unit_test::operator<<
                (in_stack_ffffffffffffbd50,(basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      in_stack_ffffffffffffbd48 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_2a00,local_2a20,local_2a40,0x10c,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffbd48);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffbd48);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
                 (const_string *)in_stack_ffffffffffffbd80,
                 CONCAT44(in_stack_ffffffffffffbd7c,in_stack_ffffffffffffbd78),
                 (const_string *)in_stack_ffffffffffffbd70);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (in_stack_ffffffffffffbd50,(char (*) [1])in_stack_ffffffffffffbd48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      local_2aa0._8_8_ =
           std::
           map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
           ::size((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                   *)in_stack_ffffffffffffbd48);
      local_2aa0._vptr_lazy_ostream =
           (_func_int **)
           std::vector<COutPoint,_std::allocator<COutPoint>_>::size
                     ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffbd48);
      in_stack_ffffffffffffbd58 = "all_spent_outpoints.size()";
      in_stack_ffffffffffffbd50 = &local_2aa0;
      in_stack_ffffffffffffbd48 = "bump_fees_all_spent.size()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
                (local_2a80,local_2a90,0x10d,1,2,&local_2aa0.m_empty);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_ffffffffffffbd48);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    ::node::MiniMiner::MiniMiner
              (in_stack_ffffffffffffc0d8,in_stack_ffffffffffffc0d0,in_stack_ffffffffffffc0c8);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
                 (const_string *)in_stack_ffffffffffffbd80,
                 CONCAT44(in_stack_ffffffffffffbd7c,in_stack_ffffffffffffbd78),
                 (const_string *)in_stack_ffffffffffffbd70);
      ::node::MiniMiner::IsReadyToCalculate((MiniMiner *)in_stack_ffffffffffffbd48);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffbd58,
                 SUB81((ulong)in_stack_ffffffffffffbd50 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      boost::unit_test::operator<<
                (in_stack_ffffffffffffbd50,(basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      in_stack_ffffffffffffbd48 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_2ad8,local_2af8,local_2b18,0x10f,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffbd48);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffbd48);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    ::node::MiniMiner::CalculateBumpFees
              (in_stack_ffffffffffffbde8,(CFeeRate *)in_stack_ffffffffffffbde0);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
                 (const_string *)in_stack_ffffffffffffbd80,
                 CONCAT44(in_stack_ffffffffffffbd7c,in_stack_ffffffffffffbd78),
                 (const_string *)in_stack_ffffffffffffbd70);
      ::node::MiniMiner::IsReadyToCalculate((MiniMiner *)in_stack_ffffffffffffbd48);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffbd58,
                 SUB81((ulong)in_stack_ffffffffffffbd50 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      boost::unit_test::operator<<
                (in_stack_ffffffffffffbd50,(basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      in_stack_ffffffffffffbd48 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_2b50,local_2b70,local_2b90,0x111,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffbd48);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffbd48);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
                 (const_string *)in_stack_ffffffffffffbd80,
                 CONCAT44(in_stack_ffffffffffffbd7c,in_stack_ffffffffffffbd78),
                 (const_string *)in_stack_ffffffffffffbd70);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (in_stack_ffffffffffffbd50,(char (*) [1])in_stack_ffffffffffffbd48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      local_2bf0._8_8_ =
           std::
           map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
           ::size((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                   *)in_stack_ffffffffffffbd48);
      local_2bf0._vptr_lazy_ostream =
           (_func_int **)
           std::vector<COutPoint,_std::allocator<COutPoint>_>::size
                     ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffbd48);
      in_stack_ffffffffffffbd58 = "all_parent_outputs.size()";
      in_stack_ffffffffffffbd50 = &local_2bf0;
      in_stack_ffffffffffffbd48 = "bump_fees_all_parents.size()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
                (local_2bd0,local_2be0,0x112,1,2);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_ffffffffffffbd48);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    std::
    map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>::
    map((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
         *)in_stack_ffffffffffffbd48,
        (map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
         *)0x75616b);
    std::
    map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>::
    map((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
         *)in_stack_ffffffffffffbd48,
        (map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
         *)0x75618a);
    local_2c00 = local_1600;
    local_2bf8 = 2;
    __begin2_1 = std::
                 initializer_list<std::map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>_>
                 ::begin((initializer_list<std::map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>_>
                          *)in_stack_ffffffffffffbd48);
    pmVar3 = std::
             initializer_list<std::map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>_>
             ::end((initializer_list<std::map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>_>
                    *)in_stack_ffffffffffffbd58);
    for (; __begin2_1 != pmVar3; __begin2_1 = __begin2_1 + 1) {
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                   (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
                   (const_string *)in_stack_ffffffffffffbd80,
                   CONCAT44(in_stack_ffffffffffffbd7c,in_stack_ffffffffffffbd78),
                   (const_string *)in_stack_ffffffffffffbd70);
        sanity_check(in_stack_ffffffffffffbde0,
                     (map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                      *)CONCAT44(in_stack_ffffffffffffbddc,in_stack_ffffffffffffbdd8));
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)in_stack_ffffffffffffbd58,
                   SUB81((ulong)in_stack_ffffffffffffbd50 >> 0x38,0));
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                   (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
        boost::unit_test::operator<<
                  (in_stack_ffffffffffffbd50,(basic_cstring<const_char> *)in_stack_ffffffffffffbd48)
        ;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                   (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
        in_stack_ffffffffffffbd48 = (char *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (local_2c38,local_2c58,local_2c78,0x116,CHECK,CHECK_PRED);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                    *)in_stack_ffffffffffffbd48);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_ffffffffffffbd48);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_ffffffffffffbd48);
      CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
      transaction_identifier::operator_cast_to_uint256_
                ((transaction_identifier<false> *)in_stack_ffffffffffffbd48);
      local_2c80 = (_Base_ptr)
                   std::
                   map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
                   ::find((map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
                           *)in_stack_ffffffffffffbd50,(key_type *)in_stack_ffffffffffffbd48);
      ppVar4 = std::_Rb_tree_iterator<std::pair<const_uint256,_TxDimensions>_>::operator->
                         ((_Rb_tree_iterator<std::pair<const_uint256,_TxDimensions>_> *)
                          in_stack_ffffffffffffbd48);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_ffffffffffffbd48);
      CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
      COutPoint::COutPoint
                ((COutPoint *)in_stack_ffffffffffffbd58,(Txid *)in_stack_ffffffffffffbd50,
                 (uint32_t)((ulong)in_stack_ffffffffffffbd48 >> 0x20));
      it0_spent = Find<COutPoint,long>
                            ((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                              *)in_stack_ffffffffffffbd90,
                             (COutPoint *)
                             CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88));
      bVar1 = operator<=((CFeeRate *)in_stack_ffffffffffffbd58,(CFeeRate *)in_stack_ffffffffffffbd50
                        );
      if (bVar1) {
        do {
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                     (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
          boost::unit_test::basic_cstring<const_char>::basic_cstring
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
          boost::unit_test::unit_test_log_t::set_checkpoint
                    ((unit_test_log_t *)
                     CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
                     (const_string *)in_stack_ffffffffffffbd80,
                     CONCAT44(in_stack_ffffffffffffbd7c,in_stack_ffffffffffffbd78),
                     (const_string *)in_stack_ffffffffffffbd70);
          boost::unit_test::lazy_ostream::instance();
          boost::unit_test::operator<<
                    (in_stack_ffffffffffffbd50,(char (*) [1])in_stack_ffffffffffffbd48);
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                     (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
          local_2cdc._vptr_lazy_ostream._0_4_ = 0;
          in_stack_ffffffffffffbd58 = "0";
          in_stack_ffffffffffffbd50 = &local_2cdc;
          in_stack_ffffffffffffbd48 = "it0_spent";
          boost::test_tools::tt_detail::
          check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
                    (local_2cc8,(undefined1 *)((long)&local_2cdc._vptr_lazy_ostream + 4),0x11c,1,2,
                     &it0_spent);
          boost::unit_test::
          lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
          ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                              *)in_stack_ffffffffffffbd48);
          bVar1 = boost::test_tools::tt_detail::dummy_cond();
        } while (bVar1);
      }
      else {
        do {
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                     (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
          boost::unit_test::basic_cstring<const_char>::basic_cstring
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
          boost::unit_test::unit_test_log_t::set_checkpoint
                    ((unit_test_log_t *)
                     CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
                     (const_string *)in_stack_ffffffffffffbd80,
                     CONCAT44(in_stack_ffffffffffffbd7c,in_stack_ffffffffffffbd78),
                     (const_string *)in_stack_ffffffffffffbd70);
          boost::unit_test::lazy_ostream::instance();
          boost::unit_test::operator<<
                    (in_stack_ffffffffffffbd50,(char (*) [1])in_stack_ffffffffffffbd48);
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                     (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
          CVar5 = CFeeRate::GetFee((CFeeRate *)
                                   CONCAT44(in_stack_ffffffffffffbd6c,in_stack_ffffffffffffbd68),
                                   in_stack_ffffffffffffbd64);
          local_2d38._vptr_lazy_ostream = (_func_int **)(CVar5 - (ppVar4->second).mod_fee);
          in_stack_ffffffffffffbd58 =
               "target_feerate.GetFee(tx0_dimensions.vsize) - tx0_dimensions.mod_fee";
          in_stack_ffffffffffffbd50 = &local_2d38;
          in_stack_ffffffffffffbd48 = "it0_spent";
          boost::test_tools::tt_detail::
          check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                    (local_2d20,&local_2d38.m_empty,0x11f,1,2,&it0_spent);
          boost::unit_test::
          lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
          ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                              *)in_stack_ffffffffffffbd48);
          bVar1 = boost::test_tools::tt_detail::dummy_cond();
        } while (bVar1);
      }
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_ffffffffffffbd48);
      CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
      transaction_identifier::operator_cast_to_uint256_
                ((transaction_identifier<false> *)in_stack_ffffffffffffbd48);
      std::
      map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
      ::find((map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
              *)in_stack_ffffffffffffbd50,(key_type *)in_stack_ffffffffffffbd48);
      ppVar4 = std::_Rb_tree_iterator<std::pair<const_uint256,_TxDimensions>_>::operator->
                         ((_Rb_tree_iterator<std::pair<const_uint256,_TxDimensions>_> *)
                          in_stack_ffffffffffffbd48);
      tx2_feerate_unbumped.nSatoshisPerK = (ppVar4->second).feerate.nSatoshisPerK;
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_ffffffffffffbd48);
      CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
      COutPoint::COutPoint
                ((COutPoint *)in_stack_ffffffffffffbd58,(Txid *)in_stack_ffffffffffffbd50,
                 (uint32_t)((ulong)in_stack_ffffffffffffbd48 >> 0x20));
      it2_spent = Find<COutPoint,long>
                            ((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                              *)in_stack_ffffffffffffbd90,
                             (COutPoint *)
                             CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88));
      bVar1 = operator<=((CFeeRate *)in_stack_ffffffffffffbd58,(CFeeRate *)in_stack_ffffffffffffbd50
                        );
      if (bVar1) {
        do {
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                     (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
          boost::unit_test::basic_cstring<const_char>::basic_cstring
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
          boost::unit_test::unit_test_log_t::set_checkpoint
                    ((unit_test_log_t *)
                     CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
                     (const_string *)in_stack_ffffffffffffbd80,
                     CONCAT44(in_stack_ffffffffffffbd7c,in_stack_ffffffffffffbd78),
                     (const_string *)in_stack_ffffffffffffbd70);
          boost::unit_test::lazy_ostream::instance();
          boost::unit_test::operator<<
                    (in_stack_ffffffffffffbd50,(char (*) [1])in_stack_ffffffffffffbd48);
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                     (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
          local_2da4._vptr_lazy_ostream._0_4_ = 0;
          in_stack_ffffffffffffbd58 = "0";
          in_stack_ffffffffffffbd50 = &local_2da4;
          in_stack_ffffffffffffbd48 = "it2_spent";
          boost::test_tools::tt_detail::
          check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
                    (local_2d90,(undefined1 *)((long)&local_2da4._vptr_lazy_ostream + 4),0x127,1,2,
                     &it2_spent);
          boost::unit_test::
          lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
          ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                              *)in_stack_ffffffffffffbd48);
          bVar1 = boost::test_tools::tt_detail::dummy_cond();
        } while (bVar1);
      }
      else {
        do {
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                     (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
          boost::unit_test::basic_cstring<const_char>::basic_cstring
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
          boost::unit_test::unit_test_log_t::set_checkpoint
                    ((unit_test_log_t *)
                     CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
                     (const_string *)in_stack_ffffffffffffbd80,
                     CONCAT44(in_stack_ffffffffffffbd7c,in_stack_ffffffffffffbd78),
                     (const_string *)in_stack_ffffffffffffbd70);
          boost::unit_test::lazy_ostream::instance();
          boost::unit_test::operator<<
                    (in_stack_ffffffffffffbd50,(char (*) [1])in_stack_ffffffffffffbd48);
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                     (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
          CVar5 = CFeeRate::GetFee((CFeeRate *)
                                   CONCAT44(in_stack_ffffffffffffbd6c,in_stack_ffffffffffffbd68),
                                   in_stack_ffffffffffffbd64);
          local_2e00._vptr_lazy_ostream = (_func_int **)(CVar5 - (ppVar4->second).mod_fee);
          in_stack_ffffffffffffbd58 =
               "target_feerate.GetFee(tx2_dimensions.vsize) - tx2_dimensions.mod_fee";
          in_stack_ffffffffffffbd50 = &local_2e00;
          in_stack_ffffffffffffbd48 = "it2_spent";
          boost::test_tools::tt_detail::
          check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                    (local_2de8,&local_2e00.m_empty,0x12a,1,2,&it2_spent);
          boost::unit_test::
          lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
          ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                              *)in_stack_ffffffffffffbd48);
          bVar1 = boost::test_tools::tt_detail::dummy_cond();
        } while (bVar1);
      }
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_ffffffffffffbd48);
      CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
      transaction_identifier::operator_cast_to_uint256_
                ((transaction_identifier<false> *)in_stack_ffffffffffffbd48);
      std::
      map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
      ::find((map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
              *)in_stack_ffffffffffffbd50,(key_type *)in_stack_ffffffffffffbd48);
      ppVar4 = std::_Rb_tree_iterator<std::pair<const_uint256,_TxDimensions>_>::operator->
                         ((_Rb_tree_iterator<std::pair<const_uint256,_TxDimensions>_> *)
                          in_stack_ffffffffffffbd48);
      tx4_feerate_unbumped.nSatoshisPerK = (ppVar4->second).feerate.nSatoshisPerK;
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_ffffffffffffbd48);
      CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
      COutPoint::COutPoint
                ((COutPoint *)in_stack_ffffffffffffbd58,(Txid *)in_stack_ffffffffffffbd50,
                 (uint32_t)((ulong)in_stack_ffffffffffffbd48 >> 0x20));
      it4_spent = Find<COutPoint,long>
                            ((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                              *)in_stack_ffffffffffffbd90,
                             (COutPoint *)
                             CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88));
      bVar1 = operator<=((CFeeRate *)in_stack_ffffffffffffbd58,(CFeeRate *)in_stack_ffffffffffffbd50
                        );
      if (bVar1) {
        do {
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                     (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
          boost::unit_test::basic_cstring<const_char>::basic_cstring
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
          boost::unit_test::unit_test_log_t::set_checkpoint
                    ((unit_test_log_t *)
                     CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
                     (const_string *)in_stack_ffffffffffffbd80,
                     CONCAT44(in_stack_ffffffffffffbd7c,in_stack_ffffffffffffbd78),
                     (const_string *)in_stack_ffffffffffffbd70);
          boost::unit_test::lazy_ostream::instance();
          boost::unit_test::operator<<
                    (in_stack_ffffffffffffbd50,(char (*) [1])in_stack_ffffffffffffbd48);
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                     (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
          local_2e6c._vptr_lazy_ostream._0_4_ = 0;
          in_stack_ffffffffffffbd58 = "0";
          in_stack_ffffffffffffbd50 = &local_2e6c;
          in_stack_ffffffffffffbd48 = "it4_spent";
          boost::test_tools::tt_detail::
          check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
                    (local_2e58,(undefined1 *)((long)&local_2e6c._vptr_lazy_ostream + 4),0x132,1,2);
          boost::unit_test::
          lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
          ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                              *)in_stack_ffffffffffffbd48);
          bVar1 = boost::test_tools::tt_detail::dummy_cond();
        } while (bVar1);
      }
      else {
        do {
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                     (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
          boost::unit_test::basic_cstring<const_char>::basic_cstring
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
          boost::unit_test::unit_test_log_t::set_checkpoint
                    ((unit_test_log_t *)
                     CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
                     (const_string *)in_stack_ffffffffffffbd80,
                     CONCAT44(in_stack_ffffffffffffbd7c,in_stack_ffffffffffffbd78),
                     (const_string *)in_stack_ffffffffffffbd70);
          boost::unit_test::lazy_ostream::instance();
          boost::unit_test::operator<<
                    (in_stack_ffffffffffffbd50,(char (*) [1])in_stack_ffffffffffffbd48);
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                     (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
          CVar5 = CFeeRate::GetFee((CFeeRate *)
                                   CONCAT44(in_stack_ffffffffffffbd6c,in_stack_ffffffffffffbd68),
                                   in_stack_ffffffffffffbd64);
          local_2ec8._vptr_lazy_ostream = (_func_int **)(CVar5 - (ppVar4->second).mod_fee);
          in_stack_ffffffffffffbd58 =
               "target_feerate.GetFee(tx4_dimensions.vsize) - tx4_dimensions.mod_fee";
          in_stack_ffffffffffffbd50 = &local_2ec8;
          in_stack_ffffffffffffbd48 = "it4_spent";
          boost::test_tools::tt_detail::
          check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                    (local_2eb0,&local_2ec8.m_empty,0x135,1,2);
          boost::unit_test::
          lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
          ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                              *)in_stack_ffffffffffffbd48);
          bVar1 = boost::test_tools::tt_detail::dummy_cond();
        } while (bVar1);
      }
    }
    local_3cf0 = &bump_fees_all_parents;
    do {
      local_3cf0 = local_3cf0 + -1;
      std::
      map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
      ::~map((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
              *)in_stack_ffffffffffffbd48);
    } while (local_3cf0 != local_1600);
    std::
    map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>::
    ~map((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
          *)in_stack_ffffffffffffbd48);
    ::node::MiniMiner::~MiniMiner((MiniMiner *)in_stack_ffffffffffffbd48);
    std::
    map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>::
    ~map((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
          *)in_stack_ffffffffffffbd48);
    ::node::MiniMiner::~MiniMiner((MiniMiner *)in_stack_ffffffffffffbd48);
    __gnu_cxx::
    __normal_iterator<const_CFeeRate_*,_std::vector<CFeeRate,_std::allocator<CFeeRate>_>_>::
    operator++((__normal_iterator<const_CFeeRate_*,_std::vector<CFeeRate,_std::allocator<CFeeRate>_>_>
                *)in_stack_ffffffffffffbd48);
  }
  std::vector<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>::vector
            ((vector<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_> *)
             in_stack_ffffffffffffbd48);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffbd48);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
  transaction_identifier::operator_cast_to_uint256_
            ((transaction_identifier<false> *)in_stack_ffffffffffffbd48);
  pmVar6 = std::
           map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
           ::at((map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
                 *)in_stack_ffffffffffffbd70,
                (key_type *)CONCAT44(in_stack_ffffffffffffbd6c,in_stack_ffffffffffffbd68));
  tx0_vsize = pmVar6->vsize;
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffbd48);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
  transaction_identifier::operator_cast_to_uint256_
            ((transaction_identifier<false> *)in_stack_ffffffffffffbd48);
  pmVar6 = std::
           map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
           ::at((map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
                 *)in_stack_ffffffffffffbd70,
                (key_type *)CONCAT44(in_stack_ffffffffffffbd6c,in_stack_ffffffffffffbd68));
  tx1_vsize = pmVar6->vsize;
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffbd48);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
  transaction_identifier::operator_cast_to_uint256_
            ((transaction_identifier<false> *)in_stack_ffffffffffffbd48);
  pmVar6 = std::
           map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
           ::at((map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
                 *)in_stack_ffffffffffffbd70,
                (key_type *)CONCAT44(in_stack_ffffffffffffbd6c,in_stack_ffffffffffffbd68));
  tx2_vsize = pmVar6->vsize;
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffbd48);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
  transaction_identifier::operator_cast_to_uint256_
            ((transaction_identifier<false> *)in_stack_ffffffffffffbd48);
  pmVar6 = std::
           map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
           ::at((map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
                 *)in_stack_ffffffffffffbd70,
                (key_type *)CONCAT44(in_stack_ffffffffffffbd6c,in_stack_ffffffffffffbd68));
  tx3_vsize = pmVar6->vsize;
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffbd48);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
  transaction_identifier::operator_cast_to_uint256_
            ((transaction_identifier<false> *)in_stack_ffffffffffffbd48);
  pmVar6 = std::
           map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
           ::at((map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
                 *)in_stack_ffffffffffffbd70,
                (key_type *)CONCAT44(in_stack_ffffffffffffbd6c,in_stack_ffffffffffffbd68));
  tx4_vsize = pmVar6->vsize;
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffbd48);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
  transaction_identifier::operator_cast_to_uint256_
            ((transaction_identifier<false> *)in_stack_ffffffffffffbd48);
  pMVar7 = (MiniMiner *)
           std::
           map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
           ::at((map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
                 *)in_stack_ffffffffffffbd70,
                (key_type *)CONCAT44(in_stack_ffffffffffffbd6c,in_stack_ffffffffffffbd68));
  tx5_vsize = *(int32_t *)pMVar7;
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffbd48);
  mempool = (CTxMemPool *)CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
  outpoints = transaction_identifier::operator_cast_to_uint256_
                        ((transaction_identifier<false> *)in_stack_ffffffffffffbd48);
  pmVar6 = std::
           map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
           ::at((map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
                 *)in_stack_ffffffffffffbd70,
                (key_type *)CONCAT44(in_stack_ffffffffffffbd6c,in_stack_ffffffffffffbd68));
  tx6_vsize = pmVar6->vsize;
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffbd48);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
  transaction_identifier::operator_cast_to_uint256_
            ((transaction_identifier<false> *)in_stack_ffffffffffffbd48);
  pmVar6 = std::
           map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
           ::at((map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
                 *)in_stack_ffffffffffffbd70,
                (key_type *)CONCAT44(in_stack_ffffffffffffbd6c,in_stack_ffffffffffffbd68));
  tx7_vsize = pmVar6->vsize;
  std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
  emplace_back<std::shared_ptr<CTransaction_const>const&,int_const&,int_const&,long_const&,long_const&>
            ((vector<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_> *)
             CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
             &in_stack_ffffffffffffbd80->tx,
             (int *)CONCAT44(in_stack_ffffffffffffbd7c,in_stack_ffffffffffffbd78),
             (int *)in_stack_ffffffffffffbd70,
             (long *)CONCAT44(in_stack_ffffffffffffbd6c,in_stack_ffffffffffffbd68),
             (long *)CONCAT44(in_stack_ffffffffffffbd64,in_stack_ffffffffffffbd60));
  local_2f04 = tx0_vsize + tx1_vsize;
  local_2f10 = 10000;
  std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
  emplace_back<std::shared_ptr<CTransaction_const>const&,int_const&,int,long_const&,long>
            ((vector<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_> *)
             CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
             &in_stack_ffffffffffffbd80->tx,
             (int *)CONCAT44(in_stack_ffffffffffffbd7c,in_stack_ffffffffffffbd78),
             (int *)in_stack_ffffffffffffbd70,
             (long *)CONCAT44(in_stack_ffffffffffffbd6c,in_stack_ffffffffffffbd68),
             (long *)CONCAT44(in_stack_ffffffffffffbd64,in_stack_ffffffffffffbd60));
  std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
  emplace_back<std::shared_ptr<CTransaction_const>const&,int_const&,int_const&,long_const&,long_const&>
            ((vector<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_> *)
             CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
             &in_stack_ffffffffffffbd80->tx,
             (int *)CONCAT44(in_stack_ffffffffffffbd7c,in_stack_ffffffffffffbd78),
             (int *)in_stack_ffffffffffffbd70,
             (long *)CONCAT44(in_stack_ffffffffffffbd6c,in_stack_ffffffffffffbd68),
             (long *)CONCAT44(in_stack_ffffffffffffbd64,in_stack_ffffffffffffbd60));
  local_2f14 = tx2_vsize + tx3_vsize;
  local_2f20 = 0x18894;
  std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
  emplace_back<std::shared_ptr<CTransaction_const>const&,int_const&,int,long_const&,long>
            ((vector<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_> *)
             CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
             &in_stack_ffffffffffffbd80->tx,
             (int *)CONCAT44(in_stack_ffffffffffffbd7c,in_stack_ffffffffffffbd78),
             (int *)in_stack_ffffffffffffbd70,
             (long *)CONCAT44(in_stack_ffffffffffffbd6c,in_stack_ffffffffffffbd68),
             (long *)CONCAT44(in_stack_ffffffffffffbd64,in_stack_ffffffffffffbd60));
  std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
  emplace_back<std::shared_ptr<CTransaction_const>const&,int_const&,int_const&,long_const&,long_const&>
            ((vector<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_> *)
             CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
             &in_stack_ffffffffffffbd80->tx,
             (int *)CONCAT44(in_stack_ffffffffffffbd7c,in_stack_ffffffffffffbd78),
             (int *)in_stack_ffffffffffffbd70,
             (long *)CONCAT44(in_stack_ffffffffffffbd6c,in_stack_ffffffffffffbd68),
             (long *)CONCAT44(in_stack_ffffffffffffbd64,in_stack_ffffffffffffbd60));
  local_2f24 = tx4_vsize + tx5_vsize;
  local_2f30 = 11000;
  std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
  emplace_back<std::shared_ptr<CTransaction_const>const&,int_const&,int,long_const&,long>
            ((vector<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_> *)
             CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
             &in_stack_ffffffffffffbd80->tx,
             (int *)CONCAT44(in_stack_ffffffffffffbd7c,in_stack_ffffffffffffbd78),
             (int *)in_stack_ffffffffffffbd70,
             (long *)CONCAT44(in_stack_ffffffffffffbd6c,in_stack_ffffffffffffbd68),
             (long *)CONCAT44(in_stack_ffffffffffffbd64,in_stack_ffffffffffffbd60));
  std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
  emplace_back<std::shared_ptr<CTransaction_const>const&,int_const&,int_const&,long_const&,long_const&>
            ((vector<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_> *)
             CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
             &in_stack_ffffffffffffbd80->tx,
             (int *)CONCAT44(in_stack_ffffffffffffbd7c,in_stack_ffffffffffffbd78),
             (int *)in_stack_ffffffffffffbd70,
             (long *)CONCAT44(in_stack_ffffffffffffbd6c,in_stack_ffffffffffffbd68),
             (long *)CONCAT44(in_stack_ffffffffffffbd64,in_stack_ffffffffffffbd60));
  local_2f34 = tx6_vsize + tx7_vsize;
  local_2f40 = 0x18894;
  std::vector<node::MiniMinerMempoolEntry,std::allocator<node::MiniMinerMempoolEntry>>::
  emplace_back<std::shared_ptr<CTransaction_const>const&,int_const&,int,long_const&,long>
            ((vector<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_> *)
             CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
             &in_stack_ffffffffffffbd80->tx,
             (int *)CONCAT44(in_stack_ffffffffffffbd7c,in_stack_ffffffffffffbd78),
             (int *)in_stack_ffffffffffffbd70,
             (long *)CONCAT44(in_stack_ffffffffffffbd6c,in_stack_ffffffffffffbd68),
             (long *)CONCAT44(in_stack_ffffffffffffbd64,in_stack_ffffffffffffbd60));
  std::
  map<transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
  ::map((map<transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
         *)in_stack_ffffffffffffbd48);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffbd48);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffbd48);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffbd48);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
  std::allocator<transaction_identifier<false>_>::allocator
            ((allocator<transaction_identifier<false>_> *)in_stack_ffffffffffffbd48);
  __l_13._M_array._4_4_ = in_stack_ffffffffffffbdb4;
  __l_13._M_array._0_4_ = in_stack_ffffffffffffbdb0;
  __l_13._M_len = (size_type)in_stack_ffffffffffffbdb8;
  std::
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
         *)in_stack_ffffffffffffbda0,__l_13,in_stack_ffffffffffffbd98,
        (allocator_type *)in_stack_ffffffffffffbd90);
  std::
  map<transaction_identifier<false>,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
  ::
  emplace<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
            ((map<transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
              *)CONCAT44(in_stack_ffffffffffffbd6c,in_stack_ffffffffffffbd68),
             (transaction_identifier<false> *)
             CONCAT44(in_stack_ffffffffffffbd64,in_stack_ffffffffffffbd60),
             (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
              *)in_stack_ffffffffffffbd58);
  std::
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  ::~set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
          *)in_stack_ffffffffffffbd48);
  std::allocator<transaction_identifier<false>_>::~allocator
            ((allocator<transaction_identifier<false>_> *)in_stack_ffffffffffffbd48);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffbd48);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffbd48);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
  std::allocator<transaction_identifier<false>_>::allocator
            ((allocator<transaction_identifier<false>_> *)in_stack_ffffffffffffbd48);
  __l_14._M_array._4_4_ = in_stack_ffffffffffffbdb4;
  __l_14._M_array._0_4_ = in_stack_ffffffffffffbdb0;
  __l_14._M_len = (size_type)in_stack_ffffffffffffbdb8;
  std::
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
         *)in_stack_ffffffffffffbda0,__l_14,in_stack_ffffffffffffbd98,
        (allocator_type *)in_stack_ffffffffffffbd90);
  std::
  map<transaction_identifier<false>,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
  ::
  emplace<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
            ((map<transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
              *)CONCAT44(in_stack_ffffffffffffbd6c,in_stack_ffffffffffffbd68),
             (transaction_identifier<false> *)
             CONCAT44(in_stack_ffffffffffffbd64,in_stack_ffffffffffffbd60),
             (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
              *)in_stack_ffffffffffffbd58);
  std::
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  ::~set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
          *)in_stack_ffffffffffffbd48);
  std::allocator<transaction_identifier<false>_>::~allocator
            ((allocator<transaction_identifier<false>_> *)in_stack_ffffffffffffbd48);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffbd48);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffbd48);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffbd48);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
  std::allocator<transaction_identifier<false>_>::allocator
            ((allocator<transaction_identifier<false>_> *)in_stack_ffffffffffffbd48);
  __l_15._M_array._4_4_ = in_stack_ffffffffffffbdb4;
  __l_15._M_array._0_4_ = in_stack_ffffffffffffbdb0;
  __l_15._M_len = (size_type)in_stack_ffffffffffffbdb8;
  std::
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
         *)in_stack_ffffffffffffbda0,__l_15,in_stack_ffffffffffffbd98,
        (allocator_type *)in_stack_ffffffffffffbd90);
  std::
  map<transaction_identifier<false>,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
  ::
  emplace<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
            ((map<transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
              *)CONCAT44(in_stack_ffffffffffffbd6c,in_stack_ffffffffffffbd68),
             (transaction_identifier<false> *)
             CONCAT44(in_stack_ffffffffffffbd64,in_stack_ffffffffffffbd60),
             (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
              *)in_stack_ffffffffffffbd58);
  std::
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  ::~set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
          *)in_stack_ffffffffffffbd48);
  std::allocator<transaction_identifier<false>_>::~allocator
            ((allocator<transaction_identifier<false>_> *)in_stack_ffffffffffffbd48);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffbd48);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffbd48);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
  std::allocator<transaction_identifier<false>_>::allocator
            ((allocator<transaction_identifier<false>_> *)in_stack_ffffffffffffbd48);
  __l_16._M_array._4_4_ = in_stack_ffffffffffffbdb4;
  __l_16._M_array._0_4_ = in_stack_ffffffffffffbdb0;
  __l_16._M_len = (size_type)in_stack_ffffffffffffbdb8;
  std::
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
         *)in_stack_ffffffffffffbda0,__l_16,in_stack_ffffffffffffbd98,
        (allocator_type *)in_stack_ffffffffffffbd90);
  std::
  map<transaction_identifier<false>,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
  ::
  emplace<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
            ((map<transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
              *)CONCAT44(in_stack_ffffffffffffbd6c,in_stack_ffffffffffffbd68),
             (transaction_identifier<false> *)
             CONCAT44(in_stack_ffffffffffffbd64,in_stack_ffffffffffffbd60),
             (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
              *)in_stack_ffffffffffffbd58);
  std::
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  ::~set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
          *)in_stack_ffffffffffffbd48);
  std::allocator<transaction_identifier<false>_>::~allocator
            ((allocator<transaction_identifier<false>_> *)in_stack_ffffffffffffbd48);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffbd48);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffbd48);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffbd48);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
  std::allocator<transaction_identifier<false>_>::allocator
            ((allocator<transaction_identifier<false>_> *)in_stack_ffffffffffffbd48);
  __l_17._M_array._4_4_ = in_stack_ffffffffffffbdb4;
  __l_17._M_array._0_4_ = in_stack_ffffffffffffbdb0;
  __l_17._M_len = (size_type)in_stack_ffffffffffffbdb8;
  std::
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
         *)in_stack_ffffffffffffbda0,__l_17,in_stack_ffffffffffffbd98,
        (allocator_type *)in_stack_ffffffffffffbd90);
  std::
  map<transaction_identifier<false>,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
  ::
  emplace<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
            ((map<transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
              *)CONCAT44(in_stack_ffffffffffffbd6c,in_stack_ffffffffffffbd68),
             (transaction_identifier<false> *)
             CONCAT44(in_stack_ffffffffffffbd64,in_stack_ffffffffffffbd60),
             (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
              *)in_stack_ffffffffffffbd58);
  std::
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  ::~set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
          *)in_stack_ffffffffffffbd48);
  std::allocator<transaction_identifier<false>_>::~allocator
            ((allocator<transaction_identifier<false>_> *)in_stack_ffffffffffffbd48);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffbd48);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffbd48);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
  std::allocator<transaction_identifier<false>_>::allocator
            ((allocator<transaction_identifier<false>_> *)in_stack_ffffffffffffbd48);
  __l_18._M_array._4_4_ = in_stack_ffffffffffffbdb4;
  __l_18._M_array._0_4_ = in_stack_ffffffffffffbdb0;
  __l_18._M_len = (size_type)in_stack_ffffffffffffbdb8;
  std::
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
         *)in_stack_ffffffffffffbda0,__l_18,in_stack_ffffffffffffbd98,
        (allocator_type *)in_stack_ffffffffffffbd90);
  std::
  map<transaction_identifier<false>,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
  ::
  emplace<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
            ((map<transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
              *)CONCAT44(in_stack_ffffffffffffbd6c,in_stack_ffffffffffffbd68),
             (transaction_identifier<false> *)
             CONCAT44(in_stack_ffffffffffffbd64,in_stack_ffffffffffffbd60),
             (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
              *)in_stack_ffffffffffffbd58);
  std::
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  ::~set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
          *)in_stack_ffffffffffffbd48);
  std::allocator<transaction_identifier<false>_>::~allocator
            ((allocator<transaction_identifier<false>_> *)in_stack_ffffffffffffbd48);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffbd48);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffbd48);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffbd48);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
  std::allocator<transaction_identifier<false>_>::allocator
            ((allocator<transaction_identifier<false>_> *)in_stack_ffffffffffffbd48);
  __l_19._M_array._4_4_ = in_stack_ffffffffffffbdb4;
  __l_19._M_array._0_4_ = in_stack_ffffffffffffbdb0;
  __l_19._M_len = (size_type)in_stack_ffffffffffffbdb8;
  std::
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
         *)in_stack_ffffffffffffbda0,__l_19,in_stack_ffffffffffffbd98,
        (allocator_type *)in_stack_ffffffffffffbd90);
  std::
  map<transaction_identifier<false>,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
  ::
  emplace<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
            ((map<transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
              *)CONCAT44(in_stack_ffffffffffffbd6c,in_stack_ffffffffffffbd68),
             (transaction_identifier<false> *)
             CONCAT44(in_stack_ffffffffffffbd64,in_stack_ffffffffffffbd60),
             (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
              *)in_stack_ffffffffffffbd58);
  std::
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  ::~set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
          *)in_stack_ffffffffffffbd48);
  std::allocator<transaction_identifier<false>_>::~allocator
            ((allocator<transaction_identifier<false>_> *)in_stack_ffffffffffffbd48);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffbd48);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffbd48);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
  std::allocator<transaction_identifier<false>_>::allocator
            ((allocator<transaction_identifier<false>_> *)in_stack_ffffffffffffbd48);
  __l_20._M_array._4_4_ = in_stack_ffffffffffffbdb4;
  __l_20._M_array._0_4_ = in_stack_ffffffffffffbdb0;
  __l_20._M_len = (size_type)in_stack_ffffffffffffbdb8;
  std::
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
         *)in_stack_ffffffffffffbda0,__l_20,in_stack_ffffffffffffbd98,
        (allocator_type *)in_stack_ffffffffffffbd90);
  std::
  map<transaction_identifier<false>,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>,std::less<transaction_identifier<false>>,std::allocator<std::pair<transaction_identifier<false>const,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>>>
  ::
  emplace<transaction_identifier<false>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>>
            ((map<transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
              *)CONCAT44(in_stack_ffffffffffffbd6c,in_stack_ffffffffffffbd68),
             (transaction_identifier<false> *)
             CONCAT44(in_stack_ffffffffffffbd64,in_stack_ffffffffffffbd60),
             (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
              *)in_stack_ffffffffffffbd58);
  std::
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  ::~set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
          *)in_stack_ffffffffffffbd48);
  std::allocator<transaction_identifier<false>_>::~allocator
            ((allocator<transaction_identifier<false>_> *)in_stack_ffffffffffffbd48);
  ::node::MiniMiner::MiniMiner
            (in_stack_ffffffffffffbe90,in_stack_ffffffffffffbe88,in_stack_ffffffffffffbe80);
  ::node::MiniMiner::MiniMiner
            (pMVar7,mempool,(vector<COutPoint,_std::allocator<COutPoint>_> *)outpoints);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
               (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
               (const_string *)in_stack_ffffffffffffbd80,
               CONCAT44(in_stack_ffffffffffffbd7c,in_stack_ffffffffffffbd78),
               (const_string *)in_stack_ffffffffffffbd70);
    ::node::MiniMiner::IsReadyToCalculate((MiniMiner *)in_stack_ffffffffffffbd48);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffbd58,
               SUB81((ulong)in_stack_ffffffffffffbd50 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
               (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffbd50,(basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
               (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
    in_stack_ffffffffffffbd48 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2f88,local_2fa8,local_2fc8,0x15e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffbd48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffbd48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
               (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
               (const_string *)in_stack_ffffffffffffbd80,
               CONCAT44(in_stack_ffffffffffffbd7c,in_stack_ffffffffffffbd78),
               (const_string *)in_stack_ffffffffffffbd70);
    ::node::MiniMiner::IsReadyToCalculate((MiniMiner *)in_stack_ffffffffffffbd48);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffbd58,
               SUB81((ulong)in_stack_ffffffffffffbd50 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
               (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffbd50,(basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
               (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
    in_stack_ffffffffffffbd48 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3000,local_3020,local_3040,0x15f,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffbd48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffbd48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  ::node::MiniMiner::Linearize
            ((MiniMiner *)CONCAT44(in_stack_ffffffffffffbd64,in_stack_ffffffffffffbd60));
  ::node::MiniMiner::Linearize
            ((MiniMiner *)CONCAT44(in_stack_ffffffffffffbd64,in_stack_ffffffffffffbd60));
  local_3050 = local_1d08;
  local_3048 = 2;
  __begin1_7 = std::
               initializer_list<std::map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>_>
               ::begin((initializer_list<std::map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>_>
                        *)in_stack_ffffffffffffbd48);
  pmVar8 = std::
           initializer_list<std::map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>_>
           ::end((initializer_list<std::map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>_>
                  *)in_stack_ffffffffffffbd58);
  for (; __begin1_7 != pmVar8; __begin1_7 = __begin1_7 + 1) {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
                 (const_string *)in_stack_ffffffffffffbd80,
                 CONCAT44(in_stack_ffffffffffffbd7c,in_stack_ffffffffffffbd78),
                 (const_string *)in_stack_ffffffffffffbd70);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (in_stack_ffffffffffffbd50,(char (*) [1])in_stack_ffffffffffffbd48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_ffffffffffffbd48);
      CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
      local_30a8._vptr_lazy_ostream._4_4_ =
           Find<transaction_identifier<false>,unsigned_int>
                     ((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                       *)in_stack_ffffffffffffbd90,
                      (transaction_identifier<false> *)
                      CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88));
      local_30a8._vptr_lazy_ostream._0_4_ = 0;
      in_stack_ffffffffffffbd58 = "0";
      in_stack_ffffffffffffbd50 = &local_30a8;
      in_stack_ffffffffffffbd48 = "Find(sequences, tx6->GetHash())";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
                (local_3090,&local_30a8.m_empty,0x162,1,2,
                 (undefined1 *)((long)&local_30a8._vptr_lazy_ostream + 4));
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_ffffffffffffbd48);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
                 (const_string *)in_stack_ffffffffffffbd80,
                 CONCAT44(in_stack_ffffffffffffbd7c,in_stack_ffffffffffffbd78),
                 (const_string *)in_stack_ffffffffffffbd70);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (in_stack_ffffffffffffbd50,(char (*) [1])in_stack_ffffffffffffbd48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_ffffffffffffbd48);
      CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
      local_3100._vptr_lazy_ostream._4_4_ =
           Find<transaction_identifier<false>,unsigned_int>
                     ((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                       *)in_stack_ffffffffffffbd90,
                      (transaction_identifier<false> *)
                      CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88));
      local_3100._vptr_lazy_ostream._0_4_ = 1;
      in_stack_ffffffffffffbd58 = "1";
      in_stack_ffffffffffffbd50 = &local_3100;
      in_stack_ffffffffffffbd48 = "Find(sequences, tx2->GetHash())";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
                (local_30e8,&local_3100.m_empty,0x165,1,2,
                 (undefined1 *)((long)&local_3100._vptr_lazy_ostream + 4));
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_ffffffffffffbd48);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
                 (const_string *)in_stack_ffffffffffffbd80,
                 CONCAT44(in_stack_ffffffffffffbd7c,in_stack_ffffffffffffbd78),
                 (const_string *)in_stack_ffffffffffffbd70);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (in_stack_ffffffffffffbd50,(char (*) [1])in_stack_ffffffffffffbd48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_ffffffffffffbd48);
      CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
      local_3158._vptr_lazy_ostream._4_4_ =
           Find<transaction_identifier<false>,unsigned_int>
                     ((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                       *)in_stack_ffffffffffffbd90,
                      (transaction_identifier<false> *)
                      CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88));
      local_3158._vptr_lazy_ostream._0_4_ = 1;
      in_stack_ffffffffffffbd58 = "1";
      in_stack_ffffffffffffbd50 = &local_3158;
      in_stack_ffffffffffffbd48 = "Find(sequences, tx3->GetHash())";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
                (local_3140,&local_3158.m_empty,0x166,1,2,
                 (undefined1 *)((long)&local_3158._vptr_lazy_ostream + 4));
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_ffffffffffffbd48);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
                 (const_string *)in_stack_ffffffffffffbd80,
                 CONCAT44(in_stack_ffffffffffffbd7c,in_stack_ffffffffffffbd78),
                 (const_string *)in_stack_ffffffffffffbd70);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (in_stack_ffffffffffffbd50,(char (*) [1])in_stack_ffffffffffffbd48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_ffffffffffffbd48);
      CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
      local_31b0._vptr_lazy_ostream._4_4_ =
           Find<transaction_identifier<false>,unsigned_int>
                     ((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                       *)in_stack_ffffffffffffbd90,
                      (transaction_identifier<false> *)
                      CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88));
      local_31b0._vptr_lazy_ostream._0_4_ = 2;
      in_stack_ffffffffffffbd58 = "2";
      in_stack_ffffffffffffbd50 = &local_31b0;
      in_stack_ffffffffffffbd48 = "Find(sequences, tx4->GetHash())";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
                (local_3198,&local_31b0.m_empty,0x169,1,2,
                 (undefined1 *)((long)&local_31b0._vptr_lazy_ostream + 4));
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_ffffffffffffbd48);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
                 (const_string *)in_stack_ffffffffffffbd80,
                 CONCAT44(in_stack_ffffffffffffbd7c,in_stack_ffffffffffffbd78),
                 (const_string *)in_stack_ffffffffffffbd70);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (in_stack_ffffffffffffbd50,(char (*) [1])in_stack_ffffffffffffbd48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_ffffffffffffbd48);
      CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
      local_3208._vptr_lazy_ostream._4_4_ =
           Find<transaction_identifier<false>,unsigned_int>
                     ((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                       *)in_stack_ffffffffffffbd90,
                      (transaction_identifier<false> *)
                      CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88));
      local_3208._vptr_lazy_ostream._0_4_ = 2;
      in_stack_ffffffffffffbd58 = "2";
      in_stack_ffffffffffffbd50 = &local_3208;
      in_stack_ffffffffffffbd48 = "Find(sequences, tx5->GetHash())";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
                (local_31f0,&local_3208.m_empty,0x16a,1,2,
                 (undefined1 *)((long)&local_3208._vptr_lazy_ostream + 4));
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_ffffffffffffbd48);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
                 (const_string *)in_stack_ffffffffffffbd80,
                 CONCAT44(in_stack_ffffffffffffbd7c,in_stack_ffffffffffffbd78),
                 (const_string *)in_stack_ffffffffffffbd70);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (in_stack_ffffffffffffbd50,(char (*) [1])in_stack_ffffffffffffbd48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_ffffffffffffbd48);
      CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
      local_3260._vptr_lazy_ostream._4_4_ =
           Find<transaction_identifier<false>,unsigned_int>
                     ((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                       *)in_stack_ffffffffffffbd90,
                      (transaction_identifier<false> *)
                      CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88));
      local_3260._vptr_lazy_ostream._0_4_ = 3;
      in_stack_ffffffffffffbd58 = "3";
      in_stack_ffffffffffffbd50 = &local_3260;
      in_stack_ffffffffffffbd48 = "Find(sequences, tx0->GetHash())";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
                (local_3248,&local_3260.m_empty,0x16c,1,2,
                 (undefined1 *)((long)&local_3260._vptr_lazy_ostream + 4));
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_ffffffffffffbd48);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
                 (const_string *)in_stack_ffffffffffffbd80,
                 CONCAT44(in_stack_ffffffffffffbd7c,in_stack_ffffffffffffbd78),
                 (const_string *)in_stack_ffffffffffffbd70);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (in_stack_ffffffffffffbd50,(char (*) [1])in_stack_ffffffffffffbd48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_ffffffffffffbd48);
      CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
      local_32b8._vptr_lazy_ostream._4_4_ =
           Find<transaction_identifier<false>,unsigned_int>
                     ((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                       *)in_stack_ffffffffffffbd90,
                      (transaction_identifier<false> *)
                      CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88));
      local_32b8._vptr_lazy_ostream._0_4_ = 3;
      in_stack_ffffffffffffbd58 = "3";
      in_stack_ffffffffffffbd50 = &local_32b8;
      in_stack_ffffffffffffbd48 = "Find(sequences, tx1->GetHash())";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
                (local_32a0,&local_32b8.m_empty,0x16d,1,2,
                 (undefined1 *)((long)&local_32b8._vptr_lazy_ostream + 4));
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_ffffffffffffbd48);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd48);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88),
                 (const_string *)in_stack_ffffffffffffbd80,
                 CONCAT44(in_stack_ffffffffffffbd7c,in_stack_ffffffffffffbd78),
                 (const_string *)in_stack_ffffffffffffbd70);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (in_stack_ffffffffffffbd50,(char (*) [1])in_stack_ffffffffffffbd48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbd58,
                 (pointer)in_stack_ffffffffffffbd50,(unsigned_long)in_stack_ffffffffffffbd48);
      in_stack_ffffffffffffbd90 = (iterator)__begin1_7;
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_ffffffffffffbd48);
      CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffbd48);
      in_stack_ffffffffffffbd8c =
           Find<transaction_identifier<false>,unsigned_int>
                     ((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                       *)in_stack_ffffffffffffbd90,
                      (transaction_identifier<false> *)
                      CONCAT44(in_stack_ffffffffffffbd8c,in_stack_ffffffffffffbd88));
      local_3310._vptr_lazy_ostream._0_4_ = 4;
      in_stack_ffffffffffffbd58 = "4";
      in_stack_ffffffffffffbd50 = &local_3310;
      in_stack_ffffffffffffbd48 = "Find(sequences, tx7->GetHash())";
      local_3310._vptr_lazy_ostream._4_4_ = in_stack_ffffffffffffbd8c;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
                (local_32f8,&local_3310.m_empty,0x171,1,2,
                 (undefined1 *)((long)&local_3310._vptr_lazy_ostream + 4));
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_ffffffffffffbd48);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
      in_stack_ffffffffffffbd88 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffbd88);
    } while (bVar1);
  }
  pMVar7 = &miniminer_pool;
  do {
    pMVar7 = (MiniMiner *)&pMVar7[-1].m_descendant_set_by_txid;
    std::
    map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
    ::~map((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
            *)in_stack_ffffffffffffbd48);
  } while (pMVar7 != (MiniMiner *)local_1d08);
  ::node::MiniMiner::~MiniMiner((MiniMiner *)in_stack_ffffffffffffbd48);
  ::node::MiniMiner::~MiniMiner((MiniMiner *)in_stack_ffffffffffffbd48);
  std::
  map<transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
  ::~map((map<transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
          *)in_stack_ffffffffffffbd48);
  std::vector<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>::~vector
            ((vector<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_> *)
             in_stack_ffffffffffffbd58);
  std::vector<COutPoint,_std::allocator<COutPoint>_>::~vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffbd58);
  std::vector<CFeeRate,_std::allocator<CFeeRate>_>::~vector
            ((vector<CFeeRate,_std::allocator<CFeeRate>_> *)in_stack_ffffffffffffbd58);
  std::
  map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
  ::~map((map<uint256,_TxDimensions,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_TxDimensions>_>_>
          *)in_stack_ffffffffffffbd48);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)in_stack_ffffffffffffbd58);
  std::vector<COutPoint,_std::allocator<COutPoint>_>::~vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffbd58);
  std::vector<COutPoint,_std::allocator<COutPoint>_>::~vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffbd58);
  std::vector<COutPoint,_std::allocator<COutPoint>_>::~vector
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffbd58);
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffbd48);
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffbd48);
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffbd48);
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffbd48);
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffbd48);
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffbd48);
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffbd48);
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffbd48);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffbd48);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffbd48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_FIXTURE_TEST_CASE(miniminer_1p1c, TestChain100Setup)
{
    CTxMemPool& pool = *Assert(m_node.mempool);
    LOCK2(::cs_main, pool.cs);
    TestMemPoolEntryHelper entry;

    // Create a parent tx0 and child tx1 with normal fees:
    const auto tx0 = make_tx({COutPoint{m_coinbase_txns[0]->GetHash(), 0}}, /*num_outputs=*/2);
    pool.addUnchecked(entry.Fee(med_fee).FromTx(tx0));
    const auto tx1 = make_tx({COutPoint{tx0->GetHash(), 0}}, /*num_outputs=*/1);
    pool.addUnchecked(entry.Fee(med_fee).FromTx(tx1));

    // Create a low-feerate parent tx2 and high-feerate child tx3 (cpfp)
    const auto tx2 = make_tx({COutPoint{m_coinbase_txns[1]->GetHash(), 0}}, /*num_outputs=*/2);
    pool.addUnchecked(entry.Fee(low_fee).FromTx(tx2));
    const auto tx3 = make_tx({COutPoint{tx2->GetHash(), 0}}, /*num_outputs=*/1);
    pool.addUnchecked(entry.Fee(high_fee).FromTx(tx3));

    // Create a parent tx4 and child tx5 where both have low fees
    const auto tx4 = make_tx({COutPoint{m_coinbase_txns[2]->GetHash(), 0}}, /*num_outputs=*/2);
    pool.addUnchecked(entry.Fee(low_fee).FromTx(tx4));
    const auto tx5 = make_tx({COutPoint{tx4->GetHash(), 0}}, /*num_outputs=*/1);
    pool.addUnchecked(entry.Fee(low_fee).FromTx(tx5));
    const CAmount tx5_delta{CENT/100};
    // Make tx5's modified fee much higher than its base fee. This should cause it to pass
    // the fee-related checks despite being low-feerate.
    pool.PrioritiseTransaction(tx5->GetHash(), tx5_delta);
    const CAmount tx5_mod_fee{low_fee + tx5_delta};

    // Create a high-feerate parent tx6, low-feerate child tx7
    const auto tx6 = make_tx({COutPoint{m_coinbase_txns[3]->GetHash(), 0}}, /*num_outputs=*/2);
    pool.addUnchecked(entry.Fee(high_fee).FromTx(tx6));
    const auto tx7 = make_tx({COutPoint{tx6->GetHash(), 0}}, /*num_outputs=*/1);
    pool.addUnchecked(entry.Fee(low_fee).FromTx(tx7));

    std::vector<COutPoint> all_unspent_outpoints({
        COutPoint{tx0->GetHash(), 1},
        COutPoint{tx1->GetHash(), 0},
        COutPoint{tx2->GetHash(), 1},
        COutPoint{tx3->GetHash(), 0},
        COutPoint{tx4->GetHash(), 1},
        COutPoint{tx5->GetHash(), 0},
        COutPoint{tx6->GetHash(), 1},
        COutPoint{tx7->GetHash(), 0}
    });
    for (const auto& outpoint : all_unspent_outpoints) BOOST_CHECK(!pool.isSpent(outpoint));

    std::vector<COutPoint> all_spent_outpoints({
        COutPoint{tx0->GetHash(), 0},
        COutPoint{tx2->GetHash(), 0},
        COutPoint{tx4->GetHash(), 0},
        COutPoint{tx6->GetHash(), 0}
    });
    for (const auto& outpoint : all_spent_outpoints) BOOST_CHECK(pool.GetConflictTx(outpoint) != nullptr);

    std::vector<COutPoint> all_parent_outputs({
        COutPoint{tx0->GetHash(), 0},
        COutPoint{tx0->GetHash(), 1},
        COutPoint{tx2->GetHash(), 0},
        COutPoint{tx2->GetHash(), 1},
        COutPoint{tx4->GetHash(), 0},
        COutPoint{tx4->GetHash(), 1},
        COutPoint{tx6->GetHash(), 0},
        COutPoint{tx6->GetHash(), 1}
    });


    std::vector<CTransactionRef> all_transactions{tx0, tx1, tx2, tx3, tx4, tx5, tx6, tx7};
    struct TxDimensions {
        int32_t vsize; CAmount mod_fee; CFeeRate feerate;
    };
    std::map<uint256, TxDimensions> tx_dims;
    for (const auto& tx : all_transactions) {
        const auto& entry{*Assert(pool.GetEntry(tx->GetHash()))};
        tx_dims.emplace(tx->GetHash(), TxDimensions{entry.GetTxSize(), entry.GetModifiedFee(),
                                              CFeeRate(entry.GetModifiedFee(), entry.GetTxSize())});
    }

    const std::vector<CFeeRate> various_normal_feerates({CFeeRate(0), CFeeRate(500), CFeeRate(999),
                                                         CFeeRate(1000), CFeeRate(2000), CFeeRate(2500),
                                                         CFeeRate(3333), CFeeRate(7800), CFeeRate(11199),
                                                         CFeeRate(23330), CFeeRate(50000), CFeeRate(5*CENT)});

    // All nonexistent entries have a bumpfee of zero, regardless of feerate
    std::vector<COutPoint> nonexistent_outpoints({ COutPoint{Txid::FromUint256(GetRandHash()), 0}, COutPoint{Txid::FromUint256(GetRandHash()), 3} });
    for (const auto& outpoint : nonexistent_outpoints) BOOST_CHECK(!pool.isSpent(outpoint));
    for (const auto& feerate : various_normal_feerates) {
        node::MiniMiner mini_miner(pool, nonexistent_outpoints);
        BOOST_CHECK(mini_miner.IsReadyToCalculate());
        auto bump_fees = mini_miner.CalculateBumpFees(feerate);
        BOOST_CHECK(!mini_miner.IsReadyToCalculate());
        BOOST_CHECK(sanity_check(all_transactions, bump_fees));
        BOOST_CHECK(bump_fees.size() == nonexistent_outpoints.size());
        for (const auto& outpoint: nonexistent_outpoints) {
            auto it = bump_fees.find(outpoint);
            BOOST_CHECK(it != bump_fees.end());
            BOOST_CHECK_EQUAL(it->second, 0);
        }
    }

    // Gather bump fees for all available UTXOs.
    for (const auto& target_feerate : various_normal_feerates) {
        node::MiniMiner mini_miner(pool, all_unspent_outpoints);
        BOOST_CHECK(mini_miner.IsReadyToCalculate());
        auto bump_fees = mini_miner.CalculateBumpFees(target_feerate);
        BOOST_CHECK(!mini_miner.IsReadyToCalculate());
        BOOST_CHECK(sanity_check(all_transactions, bump_fees));
        BOOST_CHECK_EQUAL(bump_fees.size(), all_unspent_outpoints.size());

        // Check tx0 bumpfee: no other bumper.
        const TxDimensions& tx0_dimensions = tx_dims.find(tx0->GetHash())->second;
        CAmount bumpfee0 = Find(bump_fees, COutPoint{tx0->GetHash(), 1});
        if (target_feerate <= tx0_dimensions.feerate) {
            BOOST_CHECK_EQUAL(bumpfee0, 0);
        } else {
            // Difference is fee to bump tx0 from current to target feerate.
            BOOST_CHECK_EQUAL(bumpfee0, target_feerate.GetFee(tx0_dimensions.vsize) - tx0_dimensions.mod_fee);
        }

        // Check tx2 bumpfee: assisted by tx3.
        const TxDimensions& tx2_dimensions = tx_dims.find(tx2->GetHash())->second;
        const TxDimensions& tx3_dimensions = tx_dims.find(tx3->GetHash())->second;
        const CFeeRate tx2_feerate = CFeeRate(tx2_dimensions.mod_fee + tx3_dimensions.mod_fee, tx2_dimensions.vsize + tx3_dimensions.vsize);
        CAmount bumpfee2 = Find(bump_fees, COutPoint{tx2->GetHash(), 1});
        if (target_feerate <= tx2_feerate) {
            // As long as target feerate is below tx3's ancestor feerate, there is no bump fee.
            BOOST_CHECK_EQUAL(bumpfee2, 0);
        } else {
            // Difference is fee to bump tx2 from current to target feerate, without tx3.
            BOOST_CHECK_EQUAL(bumpfee2, target_feerate.GetFee(tx2_dimensions.vsize) - tx2_dimensions.mod_fee);
        }

        // If tx5’s modified fees are sufficient for tx4 and tx5 to be picked
        // into the block, our prospective new transaction would not need to
        // bump tx4 when using tx4’s second output. If however even tx5’s
        // modified fee (which essentially indicates "effective feerate") is
        // not sufficient to bump tx4, using the second output of tx4 would
        // require our transaction to bump tx4 from scratch since we evaluate
        // transaction packages per ancestor sets and do not consider multiple
        // children’s fees.
        const TxDimensions& tx4_dimensions = tx_dims.find(tx4->GetHash())->second;
        const TxDimensions& tx5_dimensions = tx_dims.find(tx5->GetHash())->second;
        const CFeeRate tx4_feerate = CFeeRate(tx4_dimensions.mod_fee + tx5_dimensions.mod_fee, tx4_dimensions.vsize + tx5_dimensions.vsize);
        CAmount bumpfee4 = Find(bump_fees, COutPoint{tx4->GetHash(), 1});
        if (target_feerate <= tx4_feerate) {
            // As long as target feerate is below tx5's ancestor feerate, there is no bump fee.
            BOOST_CHECK_EQUAL(bumpfee4, 0);
        } else {
            // Difference is fee to bump tx4 from current to target feerate, without tx5.
            BOOST_CHECK_EQUAL(bumpfee4, target_feerate.GetFee(tx4_dimensions.vsize) - tx4_dimensions.mod_fee);
        }
    }
    // Spent outpoints should usually not be requested as they would not be
    // considered available. However, when they are explicitly requested, we
    // can calculate their bumpfee to facilitate RBF-replacements
    for (const auto& target_feerate : various_normal_feerates) {
        node::MiniMiner mini_miner_all_spent(pool, all_spent_outpoints);
        BOOST_CHECK(mini_miner_all_spent.IsReadyToCalculate());
        auto bump_fees_all_spent = mini_miner_all_spent.CalculateBumpFees(target_feerate);
        BOOST_CHECK(!mini_miner_all_spent.IsReadyToCalculate());
        BOOST_CHECK_EQUAL(bump_fees_all_spent.size(), all_spent_outpoints.size());
        node::MiniMiner mini_miner_all_parents(pool, all_parent_outputs);
        BOOST_CHECK(mini_miner_all_parents.IsReadyToCalculate());
        auto bump_fees_all_parents = mini_miner_all_parents.CalculateBumpFees(target_feerate);
        BOOST_CHECK(!mini_miner_all_parents.IsReadyToCalculate());
        BOOST_CHECK_EQUAL(bump_fees_all_parents.size(), all_parent_outputs.size());
        for (auto& bump_fees : {bump_fees_all_parents, bump_fees_all_spent}) {
            // For all_parents case, both outputs from the parent should have the same bump fee,
            // even though only one of them is in a to-be-replaced transaction.
            BOOST_CHECK(sanity_check(all_transactions, bump_fees));

            // Check tx0 bumpfee: no other bumper.
            const TxDimensions& tx0_dimensions = tx_dims.find(tx0->GetHash())->second;
            CAmount it0_spent = Find(bump_fees, COutPoint{tx0->GetHash(), 0});
            if (target_feerate <= tx0_dimensions.feerate) {
                BOOST_CHECK_EQUAL(it0_spent, 0);
            } else {
                // Difference is fee to bump tx0 from current to target feerate.
                BOOST_CHECK_EQUAL(it0_spent, target_feerate.GetFee(tx0_dimensions.vsize) - tx0_dimensions.mod_fee);
            }

            // Check tx2 bumpfee: no other bumper, because tx3 is to-be-replaced.
            const TxDimensions& tx2_dimensions = tx_dims.find(tx2->GetHash())->second;
            const CFeeRate tx2_feerate_unbumped = tx2_dimensions.feerate;
            auto it2_spent = Find(bump_fees, COutPoint{tx2->GetHash(), 0});
            if (target_feerate <= tx2_feerate_unbumped) {
                BOOST_CHECK_EQUAL(it2_spent, 0);
            } else {
                // Difference is fee to bump tx2 from current to target feerate, without tx3.
                BOOST_CHECK_EQUAL(it2_spent, target_feerate.GetFee(tx2_dimensions.vsize) - tx2_dimensions.mod_fee);
            }

            // Check tx4 bumpfee: no other bumper, because tx5 is to-be-replaced.
            const TxDimensions& tx4_dimensions = tx_dims.find(tx4->GetHash())->second;
            const CFeeRate tx4_feerate_unbumped = tx4_dimensions.feerate;
            auto it4_spent = Find(bump_fees, COutPoint{tx4->GetHash(), 0});
            if (target_feerate <= tx4_feerate_unbumped) {
                BOOST_CHECK_EQUAL(it4_spent, 0);
            } else {
                // Difference is fee to bump tx4 from current to target feerate, without tx5.
                BOOST_CHECK_EQUAL(it4_spent, target_feerate.GetFee(tx4_dimensions.vsize) - tx4_dimensions.mod_fee);
            }
        }
    }

    // Check m_inclusion_order for equivalent mempool- and manually-constructed MiniMiners.
    // (We cannot check bump fees in manually-constructed MiniMiners because it doesn't know what
    // outpoints are requested).
    std::vector<node::MiniMinerMempoolEntry> miniminer_info;
    {
        const int32_t tx0_vsize{tx_dims.at(tx0->GetHash()).vsize};
        const int32_t tx1_vsize{tx_dims.at(tx1->GetHash()).vsize};
        const int32_t tx2_vsize{tx_dims.at(tx2->GetHash()).vsize};
        const int32_t tx3_vsize{tx_dims.at(tx3->GetHash()).vsize};
        const int32_t tx4_vsize{tx_dims.at(tx4->GetHash()).vsize};
        const int32_t tx5_vsize{tx_dims.at(tx5->GetHash()).vsize};
        const int32_t tx6_vsize{tx_dims.at(tx6->GetHash()).vsize};
        const int32_t tx7_vsize{tx_dims.at(tx7->GetHash()).vsize};

        miniminer_info.emplace_back(tx0,/*vsize_self=*/tx0_vsize,/*vsize_ancestor=*/tx0_vsize,/*fee_self=*/med_fee,/*fee_ancestor=*/med_fee);
        miniminer_info.emplace_back(tx1,               tx1_vsize,       tx0_vsize + tx1_vsize,             med_fee,               2*med_fee);
        miniminer_info.emplace_back(tx2,               tx2_vsize,                   tx2_vsize,             low_fee,                 low_fee);
        miniminer_info.emplace_back(tx3,               tx3_vsize,       tx2_vsize + tx3_vsize,            high_fee,      low_fee + high_fee);
        miniminer_info.emplace_back(tx4,               tx4_vsize,                   tx4_vsize,             low_fee,                 low_fee);
        miniminer_info.emplace_back(tx5,               tx5_vsize,       tx4_vsize + tx5_vsize,         tx5_mod_fee,   low_fee + tx5_mod_fee);
        miniminer_info.emplace_back(tx6,               tx6_vsize,                   tx6_vsize,            high_fee,                high_fee);
        miniminer_info.emplace_back(tx7,               tx7_vsize,       tx6_vsize + tx7_vsize,             low_fee,      high_fee + low_fee);
    }
    std::map<Txid, std::set<Txid>> descendant_caches;
    descendant_caches.emplace(tx0->GetHash(), std::set<Txid>{tx0->GetHash(), tx1->GetHash()});
    descendant_caches.emplace(tx1->GetHash(), std::set<Txid>{tx1->GetHash()});
    descendant_caches.emplace(tx2->GetHash(), std::set<Txid>{tx2->GetHash(), tx3->GetHash()});
    descendant_caches.emplace(tx3->GetHash(), std::set<Txid>{tx3->GetHash()});
    descendant_caches.emplace(tx4->GetHash(), std::set<Txid>{tx4->GetHash(), tx5->GetHash()});
    descendant_caches.emplace(tx5->GetHash(), std::set<Txid>{tx5->GetHash()});
    descendant_caches.emplace(tx6->GetHash(), std::set<Txid>{tx6->GetHash(), tx7->GetHash()});
    descendant_caches.emplace(tx7->GetHash(), std::set<Txid>{tx7->GetHash()});

    node::MiniMiner miniminer_manual(miniminer_info, descendant_caches);
    // Use unspent outpoints to avoid entries being omitted.
    node::MiniMiner miniminer_pool(pool, all_unspent_outpoints);
    BOOST_CHECK(miniminer_manual.IsReadyToCalculate());
    BOOST_CHECK(miniminer_pool.IsReadyToCalculate());
    for (const auto& sequences : {miniminer_manual.Linearize(), miniminer_pool.Linearize()}) {
        // tx6 is selected first: high feerate with no parents to bump
        BOOST_CHECK_EQUAL(Find(sequences, tx6->GetHash()), 0);

        // tx2 + tx3 CPFP are selected next
        BOOST_CHECK_EQUAL(Find(sequences, tx2->GetHash()), 1);
        BOOST_CHECK_EQUAL(Find(sequences, tx3->GetHash()), 1);

        // tx4 + prioritised tx5 CPFP
        BOOST_CHECK_EQUAL(Find(sequences, tx4->GetHash()), 2);
        BOOST_CHECK_EQUAL(Find(sequences, tx5->GetHash()), 2);

        BOOST_CHECK_EQUAL(Find(sequences, tx0->GetHash()), 3);
        BOOST_CHECK_EQUAL(Find(sequences, tx1->GetHash()), 3);


        // tx7 is selected last: low feerate with no children
        BOOST_CHECK_EQUAL(Find(sequences, tx7->GetHash()), 4);
    }
}